

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  void *pvVar9;
  size_t sVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int *piVar76;
  void *pvVar77;
  int iVar78;
  int iVar79;
  undefined1 (*pauVar80) [32];
  int iVar81;
  uint uVar82;
  long lVar83;
  undefined4 *puVar84;
  float *pfVar85;
  undefined4 *puVar86;
  int iVar87;
  float *pfVar88;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  ulong uVar89;
  undefined1 (*pauVar90) [16];
  long lVar91;
  undefined1 (*pauVar92) [32];
  undefined1 (*pauVar93) [32];
  uint *puVar94;
  float *pfVar95;
  float *pfVar96;
  ulong uVar97;
  int iVar98;
  uint *puVar99;
  undefined1 (*pauVar100) [32];
  undefined1 (*pauVar101) [16];
  float *pfVar102;
  ulong uVar103;
  int iVar104;
  long lVar105;
  undefined1 (*pauVar106) [32];
  undefined1 (*pauVar107) [16];
  long lVar108;
  bool bVar109;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  v4sf one;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  ulong local_158;
  ulong local_150;
  ulong local_148;
  uint local_100;
  Mat local_f8;
  uint local_b0;
  uint local_ac;
  long local_a8;
  void *local_a0;
  long local_98;
  void *local_90;
  ulong local_88;
  ulong local_80;
  Mat local_78;
  undefined1 auVar166 [32];
  undefined1 auVar138 [16];
  undefined1 auVar176 [32];
  
  uVar4 = bottom_blob->elempack;
  if ((long)(int)uVar4 == 0x10) {
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    convert_packing(bottom_blob,&local_f8,8,opt);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    (*this->_vptr_Convolution1D_x86_avx512[2])(this,&local_f8,&local_78,opt);
    convert_packing(&local_78,top_blob,0x10,opt);
    piVar76 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar76 != (int *)0x0) {
      LOCK();
      *piVar76 = *piVar76 + -1;
      UNLOCK();
      if (*piVar76 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    piVar76 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar76 != (int *)0x0) {
      LOCK();
      *piVar76 = *piVar76 + -1;
      UNLOCK();
      if (*piVar76 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar104 = 0;
  }
  else {
    uVar97 = bottom_blob->elemsize;
    p_Var6 = this->_vptr_Convolution1D_x86_avx512[-3];
    iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var6);
    iVar79 = *(int *)(&this->field_0xd8 + (long)p_Var6);
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    local_f8.w = local_f8.refcount._4_4_;
    local_f8.h = (uint)local_f8.elemsize;
    Convolution1D::make_padding
              ((Convolution1D *)
               ((long)&this->_vptr_Convolution1D_x86_avx512 +
               (long)this->_vptr_Convolution1D_x86_avx512[-3]),bottom_blob,&local_f8,opt);
    iVar78 = local_f8.h;
    iVar104 = -100;
    if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
      lVar91 = 1;
      if (opt->use_packing_layout == true) {
        lVar91 = 8;
        if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]) & 7) != 0
           ) {
          lVar91 = (ulong)((*(uint *)(&this->field_0xd0 +
                                     (long)this->_vptr_Convolution1D_x86_avx512[-3]) & 3) == 0) * 3
                   + 1;
        }
      }
      uVar103 = (ulong)(uint)local_f8.h;
      uVar82 = (uint)lVar91;
      iVar5 = (local_f8.w + ~((iVar5 + -1) * iVar79)) /
              *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
      local_80 = (ulong)(iVar5 + 1U);
      uVar11 = (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]) /
               (long)(int)uVar82;
      iVar79 = (int)uVar11;
      Mat::create(top_blob,iVar5 + 1U,iVar79,lVar91 * (uVar97 / (ulong)(long)(int)uVar4),uVar82,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_b0 = uVar4 ^ 8;
        local_100 = uVar82 ^ 8;
        if ((uVar82 == 8 && local_b0 == 0) && 0 < iVar79) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          auVar173._8_4_ = 0x42b0c0a5;
          auVar173._0_8_ = 0x42b0c0a542b0c0a5;
          auVar173._12_4_ = 0x42b0c0a5;
          auVar173._16_4_ = 0x42b0c0a5;
          auVar173._20_4_ = 0x42b0c0a5;
          auVar173._24_4_ = 0x42b0c0a5;
          auVar173._28_4_ = 0x42b0c0a5;
          auVar174._8_4_ = 0xc2b0c0a5;
          auVar174._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar174._12_4_ = 0xc2b0c0a5;
          auVar174._16_4_ = 0xc2b0c0a5;
          auVar174._20_4_ = 0xc2b0c0a5;
          auVar174._24_4_ = 0xc2b0c0a5;
          auVar174._28_4_ = 0xc2b0c0a5;
          auVar183._8_4_ = 0x3f000000;
          auVar183._0_8_ = 0x3f0000003f000000;
          auVar183._12_4_ = 0x3f000000;
          auVar183._16_4_ = 0x3f000000;
          auVar183._20_4_ = 0x3f000000;
          auVar183._24_4_ = 0x3f000000;
          auVar183._28_4_ = 0x3f000000;
          auVar184._8_4_ = 0x3fb8aa3b;
          auVar184._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar184._12_4_ = 0x3fb8aa3b;
          auVar184._16_4_ = 0x3fb8aa3b;
          auVar184._20_4_ = 0x3fb8aa3b;
          auVar184._24_4_ = 0x3fb8aa3b;
          auVar184._28_4_ = 0x3fb8aa3b;
          auVar175._8_4_ = 0x3f800000;
          auVar175._0_8_ = 0x3f8000003f800000;
          auVar175._12_4_ = 0x3f800000;
          auVar175._16_4_ = 0x3f800000;
          auVar175._20_4_ = 0x3f800000;
          auVar175._24_4_ = 0x3f800000;
          auVar175._28_4_ = 0x3f800000;
          auVar176._8_4_ = 0x3f318000;
          auVar176._0_8_ = 0x3f3180003f318000;
          auVar176._12_4_ = 0x3f318000;
          auVar176._16_4_ = 0x3f318000;
          auVar176._20_4_ = 0x3f318000;
          auVar176._24_4_ = 0x3f318000;
          auVar176._28_4_ = 0x3f318000;
          auVar152 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar265._8_4_ = 0x3ab743ce;
          auVar265._0_8_ = 0x3ab743ce3ab743ce;
          auVar265._12_4_ = 0x3ab743ce;
          auVar265._16_4_ = 0x3ab743ce;
          auVar265._20_4_ = 0x3ab743ce;
          auVar265._24_4_ = 0x3ab743ce;
          auVar265._28_4_ = 0x3ab743ce;
          auVar270._8_4_ = 0x3c088908;
          auVar270._0_8_ = 0x3c0889083c088908;
          auVar270._12_4_ = 0x3c088908;
          auVar270._16_4_ = 0x3c088908;
          auVar270._20_4_ = 0x3c088908;
          auVar270._24_4_ = 0x3c088908;
          auVar270._28_4_ = 0x3c088908;
          auVar276._8_4_ = 0x3d2aa9c1;
          auVar276._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar276._12_4_ = 0x3d2aa9c1;
          auVar276._16_4_ = 0x3d2aa9c1;
          auVar276._20_4_ = 0x3d2aa9c1;
          auVar276._24_4_ = 0x3d2aa9c1;
          auVar276._28_4_ = 0x3d2aa9c1;
          auVar282._8_4_ = 0x3e2aaaaa;
          auVar282._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar282._12_4_ = 0x3e2aaaaa;
          auVar282._16_4_ = 0x3e2aaaaa;
          auVar282._20_4_ = 0x3e2aaaaa;
          auVar282._24_4_ = 0x3e2aaaaa;
          auVar282._28_4_ = 0x3e2aaaaa;
          auVar288._8_4_ = 0x3f800000;
          auVar288._0_8_ = 0x3f8000003f800000;
          auVar288._12_4_ = 0x3f800000;
          auVar288._16_4_ = 0x3f800000;
          auVar288._20_4_ = 0x3f800000;
          auVar288._24_4_ = 0x3f800000;
          auVar288._28_4_ = 0x3f800000;
          auVar294._8_4_ = 0xb95e8083;
          auVar294._0_8_ = 0xb95e8083b95e8083;
          auVar294._12_4_ = 0xb95e8083;
          auVar294._16_4_ = 0xb95e8083;
          auVar294._20_4_ = 0xb95e8083;
          auVar294._24_4_ = 0xb95e8083;
          auVar294._28_4_ = 0xb95e8083;
          auVar153 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar160 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          do {
            if (-1 < iVar5) {
              pauVar92 = (undefined1 (*) [32])
                         ((long)top_blob->w * local_158 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar98 = 0;
              iVar104 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar196 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar196 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                       local_158 * 0x20));
                }
                if (0 < iVar78) {
                  pauVar106 = (undefined1 (*) [32])
                              ((this->weight_data_packed).cstep * local_158 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var6 = pp_Var8[-3];
                  iVar87 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  puVar86 = (undefined4 *)
                            ((long)local_f8.data +
                            (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar98) * 4 + 0x1c);
                  uVar97 = 0;
                  do {
                    if (0 < iVar87) {
                      puVar84 = puVar86;
                      pauVar80 = pauVar106;
                      iVar81 = iVar87;
                      do {
                        uVar1 = puVar84[-7];
                        auVar163._4_4_ = uVar1;
                        auVar163._0_4_ = uVar1;
                        auVar163._8_4_ = uVar1;
                        auVar163._12_4_ = uVar1;
                        auVar163._16_4_ = uVar1;
                        auVar163._20_4_ = uVar1;
                        auVar163._24_4_ = uVar1;
                        auVar163._28_4_ = uVar1;
                        auVar163 = vfmadd132ps_avx512vl(*pauVar80,auVar196._0_32_,auVar163);
                        uVar1 = puVar84[-6];
                        auVar167._4_4_ = uVar1;
                        auVar167._0_4_ = uVar1;
                        auVar167._8_4_ = uVar1;
                        auVar167._12_4_ = uVar1;
                        auVar167._16_4_ = uVar1;
                        auVar167._20_4_ = uVar1;
                        auVar167._24_4_ = uVar1;
                        auVar167._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[1],auVar167);
                        uVar1 = puVar84[-5];
                        auVar164._4_4_ = uVar1;
                        auVar164._0_4_ = uVar1;
                        auVar164._8_4_ = uVar1;
                        auVar164._12_4_ = uVar1;
                        auVar164._16_4_ = uVar1;
                        auVar164._20_4_ = uVar1;
                        auVar164._24_4_ = uVar1;
                        auVar164._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[2],auVar164);
                        uVar1 = puVar84[-4];
                        auVar165._4_4_ = uVar1;
                        auVar165._0_4_ = uVar1;
                        auVar165._8_4_ = uVar1;
                        auVar165._12_4_ = uVar1;
                        auVar165._16_4_ = uVar1;
                        auVar165._20_4_ = uVar1;
                        auVar165._24_4_ = uVar1;
                        auVar165._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[3],auVar165);
                        uVar1 = puVar84[-3];
                        auVar43._4_4_ = uVar1;
                        auVar43._0_4_ = uVar1;
                        auVar43._8_4_ = uVar1;
                        auVar43._12_4_ = uVar1;
                        auVar43._16_4_ = uVar1;
                        auVar43._20_4_ = uVar1;
                        auVar43._24_4_ = uVar1;
                        auVar43._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[4],auVar43);
                        uVar1 = puVar84[-2];
                        auVar44._4_4_ = uVar1;
                        auVar44._0_4_ = uVar1;
                        auVar44._8_4_ = uVar1;
                        auVar44._12_4_ = uVar1;
                        auVar44._16_4_ = uVar1;
                        auVar44._20_4_ = uVar1;
                        auVar44._24_4_ = uVar1;
                        auVar44._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[5],auVar44);
                        uVar1 = puVar84[-1];
                        auVar45._4_4_ = uVar1;
                        auVar45._0_4_ = uVar1;
                        auVar45._8_4_ = uVar1;
                        auVar45._12_4_ = uVar1;
                        auVar45._16_4_ = uVar1;
                        auVar45._20_4_ = uVar1;
                        auVar45._24_4_ = uVar1;
                        auVar45._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[6],auVar45);
                        uVar1 = *puVar84;
                        auVar46._4_4_ = uVar1;
                        auVar46._0_4_ = uVar1;
                        auVar46._8_4_ = uVar1;
                        auVar46._12_4_ = uVar1;
                        auVar46._16_4_ = uVar1;
                        auVar46._20_4_ = uVar1;
                        auVar46._24_4_ = uVar1;
                        auVar46._28_4_ = uVar1;
                        auVar163 = vfmadd231ps_avx512vl(auVar163,pauVar80[7],auVar46);
                        auVar196 = ZEXT3264(auVar163);
                        pauVar80 = pauVar80 + 8;
                        puVar84 = puVar84 + (*(int *)(&this->field_0xd8 + (long)p_Var6) << 3);
                        iVar81 = iVar81 + -1;
                      } while (iVar81 != 0);
                      pauVar106 = pauVar106 + (ulong)(iVar87 - 1) * 8 + 8;
                    }
                    uVar97 = uVar97 + 1;
                    puVar86 = (undefined4 *)
                              ((long)puVar86 +
                              (long)local_f8.w *
                              CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize));
                  } while (uVar97 != uVar103);
                }
                auVar163 = auVar196._0_32_;
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar167 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar197._28_36_ = auVar196._28_36_;
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar163 = vmaxps_avx(auVar163,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar164 = vmaxps_avx(auVar163,auVar167);
                    auVar163 = vminps_avx(auVar163,auVar167);
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar57._4_4_ = uVar1;
                    auVar57._0_4_ = uVar1;
                    auVar57._8_4_ = uVar1;
                    auVar57._12_4_ = uVar1;
                    auVar57._16_4_ = uVar1;
                    auVar57._20_4_ = uVar1;
                    auVar57._24_4_ = uVar1;
                    auVar57._28_4_ = uVar1;
                    auVar163 = vfmadd132ps_avx512vl(auVar163,auVar164,auVar57);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar55._4_4_ = uVar1;
                    auVar55._0_4_ = uVar1;
                    auVar55._8_4_ = uVar1;
                    auVar55._12_4_ = uVar1;
                    auVar55._16_4_ = uVar1;
                    auVar55._20_4_ = uVar1;
                    auVar55._24_4_ = uVar1;
                    auVar55._28_4_ = uVar1;
                    auVar163 = vmaxps_avx512vl(auVar163,auVar55);
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar56._4_4_ = uVar1;
                    auVar56._0_4_ = uVar1;
                    auVar56._8_4_ = uVar1;
                    auVar56._12_4_ = uVar1;
                    auVar56._16_4_ = uVar1;
                    auVar56._20_4_ = uVar1;
                    auVar56._24_4_ = uVar1;
                    auVar56._28_4_ = uVar1;
                    auVar163 = vminps_avx512vl(auVar163,auVar56);
                    break;
                  case 4:
                    auVar53._8_4_ = 0x80000000;
                    auVar53._0_8_ = 0x8000000080000000;
                    auVar53._12_4_ = 0x80000000;
                    auVar53._16_4_ = 0x80000000;
                    auVar53._20_4_ = 0x80000000;
                    auVar53._24_4_ = 0x80000000;
                    auVar53._28_4_ = 0x80000000;
                    auVar163 = vxorps_avx512vl(auVar163,auVar53);
                    auVar163 = vminps_avx(auVar163,auVar173);
                    auVar163 = vmaxps_avx(auVar163,auVar174);
                    auVar110 = vfmadd231ps_fma(auVar183,auVar163,auVar184);
                    auVar167 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar167,1);
                    auVar164 = vsubps_avx512vl(auVar167,auVar175);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar172._0_4_ =
                         (uint)bVar109 * auVar164._0_4_ | (uint)!bVar109 * auVar167._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar172._4_4_ =
                         (uint)bVar109 * auVar164._4_4_ | (uint)!bVar109 * auVar167._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar172._8_4_ =
                         (uint)bVar109 * auVar164._8_4_ | (uint)!bVar109 * auVar167._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar172._12_4_ =
                         (uint)bVar109 * auVar164._12_4_ | (uint)!bVar109 * auVar167._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar172._16_4_ =
                         (uint)bVar109 * auVar164._16_4_ | (uint)!bVar109 * auVar167._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar172._20_4_ =
                         (uint)bVar109 * auVar164._20_4_ | (uint)!bVar109 * auVar167._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar172._24_4_ =
                         (uint)bVar109 * auVar164._24_4_ | (uint)!bVar109 * auVar167._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar172._28_4_ =
                         (uint)bVar109 * auVar164._28_4_ | (uint)!bVar109 * auVar167._28_4_;
                    auVar163 = vfmsub231ps_avx512vl(auVar163,auVar172,auVar176);
                    auVar54._8_4_ = 0x395e8083;
                    auVar54._0_8_ = 0x395e8083395e8083;
                    auVar54._12_4_ = 0x395e8083;
                    auVar54._16_4_ = 0x395e8083;
                    auVar54._20_4_ = 0x395e8083;
                    auVar54._24_4_ = 0x395e8083;
                    auVar54._28_4_ = 0x395e8083;
                    auVar163 = vfmsub231ps_avx512vl(auVar163,auVar172,auVar54);
                    auVar237._0_4_ = auVar163._0_4_ * auVar163._0_4_;
                    auVar237._4_4_ = auVar163._4_4_ * auVar163._4_4_;
                    auVar237._8_4_ = auVar163._8_4_ * auVar163._8_4_;
                    auVar237._12_4_ = auVar163._12_4_ * auVar163._12_4_;
                    auVar237._16_4_ = auVar163._16_4_ * auVar163._16_4_;
                    auVar237._20_4_ = auVar163._20_4_ * auVar163._20_4_;
                    auVar237._24_4_ = auVar163._24_4_ * auVar163._24_4_;
                    auVar237._28_4_ = 0;
                    auVar110 = vfmadd213ps_fma(auVar152,auVar163,auVar265);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar163,auVar270);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar163,auVar276);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar163,auVar282);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar163,auVar183);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar237,auVar163);
                    auVar238._0_4_ = auVar110._0_4_ + 1.0;
                    auVar238._4_4_ = auVar110._4_4_ + 1.0;
                    auVar238._8_4_ = auVar110._8_4_ + 1.0;
                    auVar238._12_4_ = auVar110._12_4_ + 1.0;
                    auVar238._16_4_ = 0x3f800000;
                    auVar238._20_4_ = 0x3f800000;
                    auVar238._24_4_ = 0x3f800000;
                    auVar238._28_4_ = 0x3f800000;
                    auVar163 = vcvttps2dq_avx512vl(auVar172);
                    auVar163 = vpslld_avx2(auVar163,0x17);
                    auVar163 = vpaddd_avx2(auVar288,auVar163);
                    auVar110 = vfmadd213ps_fma(auVar163,auVar238,auVar175);
                    auVar163 = vrcpps_avx(ZEXT1632(auVar110));
                    auVar110 = vfmsub213ps_fma(ZEXT1632(auVar110),auVar163,auVar175);
                    auVar110 = vfnmadd132ps_fma(ZEXT1632(auVar110),auVar163,auVar163);
                    auVar163 = ZEXT1632(auVar110);
                    break;
                  case 5:
                    auVar163 = vminps_avx(auVar163,auVar173);
                    auVar163 = vmaxps_avx(auVar163,auVar174);
                    auVar110 = vfmadd213ps_fma(auVar184,auVar163,auVar183);
                    auVar164 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar164,1);
                    auVar165 = vsubps_avx512vl(auVar164,auVar175);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar166._0_4_ =
                         (uint)bVar109 * auVar165._0_4_ | (uint)!bVar109 * auVar164._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar166._4_4_ =
                         (uint)bVar109 * auVar165._4_4_ | (uint)!bVar109 * auVar164._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar166._8_4_ =
                         (uint)bVar109 * auVar165._8_4_ | (uint)!bVar109 * auVar164._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar166._12_4_ =
                         (uint)bVar109 * auVar165._12_4_ | (uint)!bVar109 * auVar164._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar166._16_4_ =
                         (uint)bVar109 * auVar165._16_4_ | (uint)!bVar109 * auVar164._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar166._20_4_ =
                         (uint)bVar109 * auVar165._20_4_ | (uint)!bVar109 * auVar164._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar166._24_4_ =
                         (uint)bVar109 * auVar165._24_4_ | (uint)!bVar109 * auVar164._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar166._28_4_ =
                         (uint)bVar109 * auVar165._28_4_ | (uint)!bVar109 * auVar164._28_4_;
                    auVar163 = vfmsub231ps_avx512vl(auVar163,auVar166,auVar176);
                    auVar163 = vfnmsub231ps_avx512vl(auVar163,auVar166,auVar294);
                    auVar256._0_4_ = auVar163._0_4_ * auVar163._0_4_;
                    auVar256._4_4_ = auVar163._4_4_ * auVar163._4_4_;
                    auVar256._8_4_ = auVar163._8_4_ * auVar163._8_4_;
                    auVar256._12_4_ = auVar163._12_4_ * auVar163._12_4_;
                    auVar256._16_4_ = auVar163._16_4_ * auVar163._16_4_;
                    auVar256._20_4_ = auVar163._20_4_ * auVar163._20_4_;
                    auVar256._24_4_ = auVar163._24_4_ * auVar163._24_4_;
                    auVar256._28_4_ = 0;
                    auVar164 = vfmadd213ps_avx512vl(auVar152,auVar163,auVar265);
                    auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar270);
                    auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar276);
                    auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar282);
                    auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar183);
                    auVar163 = vfmadd213ps_avx512vl(auVar164,auVar256,auVar163);
                    auVar164 = vaddps_avx512vl(auVar163,auVar175);
                    auVar163 = vcvttps2dq_avx512vl(auVar166);
                    auVar163 = vpslld_avx2(auVar163,0x17);
                    auVar163 = vpaddd_avx2(auVar163,auVar288);
                    auVar110 = vfmadd213ps_fma(auVar163,auVar164,auVar175);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar167,2);
                    auVar48._8_4_ = 0x800000;
                    auVar48._0_8_ = 0x80000000800000;
                    auVar48._12_4_ = 0x800000;
                    auVar48._16_4_ = 0x800000;
                    auVar48._20_4_ = 0x800000;
                    auVar48._24_4_ = 0x800000;
                    auVar48._28_4_ = 0x800000;
                    auVar163 = vmaxps_avx512vl(ZEXT1632(auVar110),auVar48);
                    auVar165 = vpsrld_avx2(auVar163,0x17);
                    auVar167 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar49._8_4_ = 0x3f000000;
                    auVar49._0_8_ = 0x3f0000003f000000;
                    auVar49._12_4_ = 0x3f000000;
                    auVar49._16_4_ = 0x3f000000;
                    auVar49._20_4_ = 0x3f000000;
                    auVar49._24_4_ = 0x3f000000;
                    auVar49._28_4_ = 0x3f000000;
                    auVar163 = vpternlogd_avx512vl(auVar163,auVar167,auVar49,0xea);
                    auVar50._8_4_ = 0x3f3504f3;
                    auVar50._0_8_ = 0x3f3504f33f3504f3;
                    auVar50._12_4_ = 0x3f3504f3;
                    auVar50._16_4_ = 0x3f3504f3;
                    auVar50._20_4_ = 0x3f3504f3;
                    auVar50._24_4_ = 0x3f3504f3;
                    auVar50._28_4_ = 0x3f3504f3;
                    uVar89 = vcmpps_avx512vl(auVar163,auVar50,1);
                    auVar167 = vaddps_avx512vl(auVar163,auVar153);
                    auVar163 = vaddps_avx512vl(auVar167,auVar163);
                    bVar109 = (bool)((byte)uVar89 & 1);
                    auVar168._0_4_ =
                         (uint)bVar109 * auVar163._0_4_ | (uint)!bVar109 * auVar167._0_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar168._4_4_ =
                         (uint)bVar109 * auVar163._4_4_ | (uint)!bVar109 * auVar167._4_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar168._8_4_ =
                         (uint)bVar109 * auVar163._8_4_ | (uint)!bVar109 * auVar167._8_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar168._12_4_ =
                         (uint)bVar109 * auVar163._12_4_ | (uint)!bVar109 * auVar167._12_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar168._16_4_ =
                         (uint)bVar109 * auVar163._16_4_ | (uint)!bVar109 * auVar167._16_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar168._20_4_ =
                         (uint)bVar109 * auVar163._20_4_ | (uint)!bVar109 * auVar167._20_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar168._24_4_ =
                         (uint)bVar109 * auVar163._24_4_ | (uint)!bVar109 * auVar167._24_4_;
                    bVar109 = SUB81(uVar89 >> 7,0);
                    auVar168._28_4_ =
                         (uint)bVar109 * auVar163._28_4_ | (uint)!bVar109 * auVar167._28_4_;
                    auVar167 = vmulps_avx512vl(auVar168,auVar168);
                    auVar51._8_4_ = 0xbdebd1b8;
                    auVar51._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar51._12_4_ = 0xbdebd1b8;
                    auVar51._16_4_ = 0xbdebd1b8;
                    auVar51._20_4_ = 0xbdebd1b8;
                    auVar51._24_4_ = 0xbdebd1b8;
                    auVar51._28_4_ = 0xbdebd1b8;
                    auVar163 = vfmadd213ps_avx512vl(auVar154,auVar168,auVar51);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar155);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar156);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar157);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar158);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar159);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar160);
                    auVar163 = vfmadd213ps_avx512vl(auVar163,auVar168,auVar161);
                    auVar164 = vmulps_avx512vl(auVar167,auVar168);
                    auVar164 = vmulps_avx512vl(auVar164,auVar163);
                    auVar52._8_4_ = 0xffffff82;
                    auVar52._0_8_ = 0xffffff82ffffff82;
                    auVar52._12_4_ = 0xffffff82;
                    auVar52._16_4_ = 0xffffff82;
                    auVar52._20_4_ = 0xffffff82;
                    auVar52._24_4_ = 0xffffff82;
                    auVar52._28_4_ = 0xffffff82;
                    auVar163 = vpaddd_avx512vl(auVar165,auVar52);
                    auVar163 = vcvtdq2ps_avx(auVar163);
                    auVar165 = vsubps_avx512vl(auVar163,auVar175);
                    bVar109 = (bool)((byte)uVar89 & 1);
                    auVar169._0_4_ =
                         (uint)bVar109 * auVar165._0_4_ | (uint)!bVar109 * auVar163._0_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar169._4_4_ =
                         (uint)bVar109 * auVar165._4_4_ | (uint)!bVar109 * auVar163._4_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar169._8_4_ =
                         (uint)bVar109 * auVar165._8_4_ | (uint)!bVar109 * auVar163._8_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar169._12_4_ =
                         (uint)bVar109 * auVar165._12_4_ | (uint)!bVar109 * auVar163._12_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar169._16_4_ =
                         (uint)bVar109 * auVar165._16_4_ | (uint)!bVar109 * auVar163._16_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar169._20_4_ =
                         (uint)bVar109 * auVar165._20_4_ | (uint)!bVar109 * auVar163._20_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar169._24_4_ =
                         (uint)bVar109 * auVar165._24_4_ | (uint)!bVar109 * auVar163._24_4_;
                    bVar109 = SUB81(uVar89 >> 7,0);
                    auVar169._28_4_ =
                         (uint)bVar109 * auVar165._28_4_ | (uint)!bVar109 * auVar163._28_4_;
                    auVar163 = vfmadd231ps_avx512vl(auVar164,auVar169,auVar294);
                    auVar163 = vfmsub231ps_avx512vl(auVar163,auVar183,auVar167);
                    auVar163 = vsubps_avx512vl(auVar163,auVar168);
                    auVar110 = vfmsub231ps_fma(auVar163,auVar176,auVar169);
                    auVar163 = vmulps_avx512vl(ZEXT1632(auVar110),auVar162);
                    auVar167 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar170._0_4_ =
                         (uint)bVar109 * auVar167._0_4_ | (uint)!bVar109 * auVar163._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar170._4_4_ =
                         (uint)bVar109 * auVar167._4_4_ | (uint)!bVar109 * auVar163._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar170._8_4_ =
                         (uint)bVar109 * auVar167._8_4_ | (uint)!bVar109 * auVar163._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar170._12_4_ =
                         (uint)bVar109 * auVar167._12_4_ | (uint)!bVar109 * auVar163._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar170._16_4_ =
                         (uint)bVar109 * auVar167._16_4_ | (uint)!bVar109 * auVar163._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar170._20_4_ =
                         (uint)bVar109 * auVar167._20_4_ | (uint)!bVar109 * auVar163._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar170._24_4_ =
                         (uint)bVar109 * auVar167._24_4_ | (uint)!bVar109 * auVar163._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar170._28_4_ =
                         (uint)bVar109 * auVar167._28_4_ | (uint)!bVar109 * auVar163._28_4_;
                    auVar163 = vminps_avx(auVar170,auVar173);
                    auVar163 = vmaxps_avx(auVar163,auVar174);
                    auVar110 = vfmadd213ps_fma(auVar184,auVar163,auVar183);
                    auVar167 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar167,1);
                    auVar164 = vsubps_avx512vl(auVar167,auVar175);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar171._0_4_ =
                         (uint)bVar109 * auVar164._0_4_ | (uint)!bVar109 * auVar167._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar171._4_4_ =
                         (uint)bVar109 * auVar164._4_4_ | (uint)!bVar109 * auVar167._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar171._8_4_ =
                         (uint)bVar109 * auVar164._8_4_ | (uint)!bVar109 * auVar167._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar171._12_4_ =
                         (uint)bVar109 * auVar164._12_4_ | (uint)!bVar109 * auVar167._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar171._16_4_ =
                         (uint)bVar109 * auVar164._16_4_ | (uint)!bVar109 * auVar167._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar171._20_4_ =
                         (uint)bVar109 * auVar164._20_4_ | (uint)!bVar109 * auVar167._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar171._24_4_ =
                         (uint)bVar109 * auVar164._24_4_ | (uint)!bVar109 * auVar167._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar171._28_4_ =
                         (uint)bVar109 * auVar164._28_4_ | (uint)!bVar109 * auVar167._28_4_;
                    auVar163 = vfmsub231ps_avx512vl(auVar163,auVar171,auVar176);
                    auVar163 = vfnmsub231ps_avx512vl(auVar163,auVar171,auVar294);
                    auVar257._0_4_ = auVar163._0_4_ * auVar163._0_4_;
                    auVar257._4_4_ = auVar163._4_4_ * auVar163._4_4_;
                    auVar257._8_4_ = auVar163._8_4_ * auVar163._8_4_;
                    auVar257._12_4_ = auVar163._12_4_ * auVar163._12_4_;
                    auVar257._16_4_ = auVar163._16_4_ * auVar163._16_4_;
                    auVar257._20_4_ = auVar163._20_4_ * auVar163._20_4_;
                    auVar257._24_4_ = auVar163._24_4_ * auVar163._24_4_;
                    auVar257._28_4_ = 0;
                    auVar167 = vfmadd213ps_avx512vl(auVar152,auVar163,auVar265);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar163,auVar270);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar163,auVar276);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar163,auVar282);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar163,auVar183);
                    auVar163 = vfmadd213ps_avx512vl(auVar167,auVar257,auVar163);
                    auVar167 = vaddps_avx512vl(auVar163,auVar175);
                    auVar163 = vcvttps2dq_avx512vl(auVar171);
                    auVar163 = vpslld_avx2(auVar163,0x17);
                    auVar163 = vpaddd_avx2(auVar163,auVar288);
                    auVar110 = vfmadd213ps_fma(auVar163,auVar167,auVar175);
                    auVar163 = vrcpps_avx(ZEXT1632(auVar110));
                    auVar110 = vfmsub213ps_fma(ZEXT1632(auVar110),auVar163,auVar175);
                    auVar110 = vfnmadd132ps_fma(ZEXT1632(auVar110),auVar163,auVar163);
                    auVar163 = vfnmadd213ps_avx512vl(ZEXT1632(auVar110),auVar162,auVar153);
                    auVar197._0_4_ = auVar163._0_4_ * auVar196._0_4_;
                    auVar197._4_4_ = auVar163._4_4_ * auVar196._4_4_;
                    auVar197._8_4_ = auVar163._8_4_ * auVar196._8_4_;
                    auVar197._12_4_ = auVar163._12_4_ * auVar196._12_4_;
                    auVar197._16_4_ = auVar163._16_4_ * auVar196._16_4_;
                    auVar197._20_4_ = auVar163._20_4_ * auVar196._20_4_;
                    auVar197._24_4_ = auVar163._24_4_ * auVar196._24_4_;
                    auVar163 = auVar197._0_32_;
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar239._4_4_ = uVar1;
                    auVar239._0_4_ = uVar1;
                    auVar239._8_4_ = uVar1;
                    auVar239._12_4_ = uVar1;
                    auVar239._16_4_ = uVar1;
                    auVar239._20_4_ = uVar1;
                    auVar239._24_4_ = uVar1;
                    auVar239._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar47._4_4_ = uVar1;
                    auVar47._0_4_ = uVar1;
                    auVar47._8_4_ = uVar1;
                    auVar47._12_4_ = uVar1;
                    auVar47._16_4_ = uVar1;
                    auVar47._20_4_ = uVar1;
                    auVar47._24_4_ = uVar1;
                    auVar47._28_4_ = uVar1;
                    auVar163 = vfmadd213ps_avx512vl(auVar239,auVar163,auVar47);
                    auVar163 = vmaxps_avx(auVar163,auVar167);
                    auVar163 = vminps_avx(auVar163,auVar175);
                    auVar198._0_4_ = auVar163._0_4_ * auVar196._0_4_;
                    auVar198._4_4_ = auVar163._4_4_ * auVar196._4_4_;
                    auVar198._8_4_ = auVar163._8_4_ * auVar196._8_4_;
                    auVar198._12_4_ = auVar163._12_4_ * auVar196._12_4_;
                    auVar198._16_4_ = auVar163._16_4_ * auVar196._16_4_;
                    auVar198._20_4_ = auVar163._20_4_ * auVar196._20_4_;
                    auVar198._24_4_ = auVar163._24_4_ * auVar196._24_4_;
                    auVar198._28_36_ = auVar197._28_36_;
                    auVar163 = auVar198._0_32_;
                  }
                }
                *pauVar92 = auVar163;
                pauVar92 = pauVar92 + 1;
                iVar98 = iVar98 + 8;
                bVar109 = iVar104 != iVar5;
                iVar104 = iVar104 + 1;
              } while (bVar109);
            }
            local_158 = local_158 + 1;
          } while (local_158 != (uVar11 & 0xffffffff));
        }
        if ((uVar4 == 1 && local_100 == 0) && 0 < iVar79) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_150 = 0;
          auVar205._8_4_ = 0x42b0c0a5;
          auVar205._0_8_ = 0x42b0c0a542b0c0a5;
          auVar205._12_4_ = 0x42b0c0a5;
          auVar205._16_4_ = 0x42b0c0a5;
          auVar205._20_4_ = 0x42b0c0a5;
          auVar205._24_4_ = 0x42b0c0a5;
          auVar205._28_4_ = 0x42b0c0a5;
          auVar210._8_4_ = 0xc2b0c0a5;
          auVar210._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar210._12_4_ = 0xc2b0c0a5;
          auVar210._16_4_ = 0xc2b0c0a5;
          auVar210._20_4_ = 0xc2b0c0a5;
          auVar210._24_4_ = 0xc2b0c0a5;
          auVar210._28_4_ = 0xc2b0c0a5;
          auVar214._8_4_ = 0x3f000000;
          auVar214._0_8_ = 0x3f0000003f000000;
          auVar214._12_4_ = 0x3f000000;
          auVar214._16_4_ = 0x3f000000;
          auVar214._20_4_ = 0x3f000000;
          auVar214._24_4_ = 0x3f000000;
          auVar214._28_4_ = 0x3f000000;
          auVar218._8_4_ = 0x3fb8aa3b;
          auVar218._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar218._12_4_ = 0x3fb8aa3b;
          auVar218._16_4_ = 0x3fb8aa3b;
          auVar218._20_4_ = 0x3fb8aa3b;
          auVar218._24_4_ = 0x3fb8aa3b;
          auVar218._28_4_ = 0x3fb8aa3b;
          auVar222._8_4_ = 0x3f800000;
          auVar222._0_8_ = 0x3f8000003f800000;
          auVar222._12_4_ = 0x3f800000;
          auVar222._16_4_ = 0x3f800000;
          auVar222._20_4_ = 0x3f800000;
          auVar222._24_4_ = 0x3f800000;
          auVar222._28_4_ = 0x3f800000;
          auVar226._8_4_ = 0x3f318000;
          auVar226._0_8_ = 0x3f3180003f318000;
          auVar226._12_4_ = 0x3f318000;
          auVar226._16_4_ = 0x3f318000;
          auVar226._20_4_ = 0x3f318000;
          auVar226._24_4_ = 0x3f318000;
          auVar226._28_4_ = 0x3f318000;
          auVar152 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar266._8_4_ = 0x3ab743ce;
          auVar266._0_8_ = 0x3ab743ce3ab743ce;
          auVar266._12_4_ = 0x3ab743ce;
          auVar266._16_4_ = 0x3ab743ce;
          auVar266._20_4_ = 0x3ab743ce;
          auVar266._24_4_ = 0x3ab743ce;
          auVar266._28_4_ = 0x3ab743ce;
          auVar271._8_4_ = 0x3c088908;
          auVar271._0_8_ = 0x3c0889083c088908;
          auVar271._12_4_ = 0x3c088908;
          auVar271._16_4_ = 0x3c088908;
          auVar271._20_4_ = 0x3c088908;
          auVar271._24_4_ = 0x3c088908;
          auVar271._28_4_ = 0x3c088908;
          auVar277._8_4_ = 0x3d2aa9c1;
          auVar277._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar277._12_4_ = 0x3d2aa9c1;
          auVar277._16_4_ = 0x3d2aa9c1;
          auVar277._20_4_ = 0x3d2aa9c1;
          auVar277._24_4_ = 0x3d2aa9c1;
          auVar277._28_4_ = 0x3d2aa9c1;
          auVar283._8_4_ = 0x3e2aaaaa;
          auVar283._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar283._12_4_ = 0x3e2aaaaa;
          auVar283._16_4_ = 0x3e2aaaaa;
          auVar283._20_4_ = 0x3e2aaaaa;
          auVar283._24_4_ = 0x3e2aaaaa;
          auVar283._28_4_ = 0x3e2aaaaa;
          auVar289._8_4_ = 0x3f800000;
          auVar289._0_8_ = 0x3f8000003f800000;
          auVar289._12_4_ = 0x3f800000;
          auVar289._16_4_ = 0x3f800000;
          auVar289._20_4_ = 0x3f800000;
          auVar289._24_4_ = 0x3f800000;
          auVar289._28_4_ = 0x3f800000;
          auVar295._8_4_ = 0xb95e8083;
          auVar295._0_8_ = 0xb95e8083b95e8083;
          auVar295._12_4_ = 0xb95e8083;
          auVar295._16_4_ = 0xb95e8083;
          auVar295._20_4_ = 0xb95e8083;
          auVar295._24_4_ = 0xb95e8083;
          auVar295._28_4_ = 0xb95e8083;
          auVar153 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar154 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar160 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar173 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar174 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          do {
            if (-1 < iVar5) {
              pauVar92 = (undefined1 (*) [32])
                         ((long)top_blob->w * local_150 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar104 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar196 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar196 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                       local_150 * 0x20));
                }
                if (0 < iVar78) {
                  pauVar106 = (undefined1 (*) [32])
                              ((this->weight_data_packed).cstep * local_150 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var6 = pp_Var8[-3];
                  iVar98 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  puVar86 = (undefined4 *)
                            ((long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar104) * 4 +
                            (long)local_f8.data);
                  uVar97 = 0;
                  do {
                    if (0 < iVar98) {
                      pauVar80 = pauVar106;
                      puVar84 = puVar86;
                      iVar87 = iVar98;
                      do {
                        uVar1 = *puVar84;
                        auVar240._4_4_ = uVar1;
                        auVar240._0_4_ = uVar1;
                        auVar240._8_4_ = uVar1;
                        auVar240._12_4_ = uVar1;
                        auVar240._16_4_ = uVar1;
                        auVar240._20_4_ = uVar1;
                        auVar240._24_4_ = uVar1;
                        auVar240._28_4_ = uVar1;
                        auVar110 = vfmadd231ps_fma(auVar196._0_32_,auVar240,*pauVar80);
                        auVar196 = ZEXT1664(auVar110);
                        pauVar80 = pauVar80 + 1;
                        puVar84 = puVar84 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                        iVar87 = iVar87 + -1;
                      } while (iVar87 != 0);
                      pauVar106 = pauVar106 + (ulong)(iVar98 - 1) + 1;
                    }
                    uVar97 = uVar97 + 1;
                    puVar86 = (undefined4 *)
                              ((long)puVar86 +
                              (long)local_f8.w *
                              CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize));
                  } while (uVar97 != uVar103);
                }
                auVar183 = auVar196._0_32_;
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar184 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar199._28_36_ = auVar196._28_36_;
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar183 = vmaxps_avx(auVar183,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar175 = vmaxps_avx(auVar183,auVar184);
                    auVar183 = vminps_avx(auVar183,auVar184);
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar66._4_4_ = uVar1;
                    auVar66._0_4_ = uVar1;
                    auVar66._8_4_ = uVar1;
                    auVar66._12_4_ = uVar1;
                    auVar66._16_4_ = uVar1;
                    auVar66._20_4_ = uVar1;
                    auVar66._24_4_ = uVar1;
                    auVar66._28_4_ = uVar1;
                    auVar183 = vfmadd132ps_avx512vl(auVar183,auVar175,auVar66);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar64._4_4_ = uVar1;
                    auVar64._0_4_ = uVar1;
                    auVar64._8_4_ = uVar1;
                    auVar64._12_4_ = uVar1;
                    auVar64._16_4_ = uVar1;
                    auVar64._20_4_ = uVar1;
                    auVar64._24_4_ = uVar1;
                    auVar64._28_4_ = uVar1;
                    auVar183 = vmaxps_avx512vl(auVar183,auVar64);
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar65._4_4_ = uVar1;
                    auVar65._0_4_ = uVar1;
                    auVar65._8_4_ = uVar1;
                    auVar65._12_4_ = uVar1;
                    auVar65._16_4_ = uVar1;
                    auVar65._20_4_ = uVar1;
                    auVar65._24_4_ = uVar1;
                    auVar65._28_4_ = uVar1;
                    auVar183 = vminps_avx512vl(auVar183,auVar65);
                    break;
                  case 4:
                    auVar62._8_4_ = 0x80000000;
                    auVar62._0_8_ = 0x8000000080000000;
                    auVar62._12_4_ = 0x80000000;
                    auVar62._16_4_ = 0x80000000;
                    auVar62._20_4_ = 0x80000000;
                    auVar62._24_4_ = 0x80000000;
                    auVar62._28_4_ = 0x80000000;
                    auVar183 = vxorps_avx512vl(auVar183,auVar62);
                    auVar183 = vminps_avx(auVar183,auVar205);
                    auVar183 = vmaxps_avx(auVar183,auVar210);
                    auVar110 = vfmadd231ps_fma(auVar214,auVar183,auVar218);
                    auVar184 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar184,1);
                    auVar175 = vsubps_avx512vl(auVar184,auVar222);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar182._0_4_ =
                         (uint)bVar109 * auVar175._0_4_ | (uint)!bVar109 * auVar184._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar182._4_4_ =
                         (uint)bVar109 * auVar175._4_4_ | (uint)!bVar109 * auVar184._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar182._8_4_ =
                         (uint)bVar109 * auVar175._8_4_ | (uint)!bVar109 * auVar184._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar182._12_4_ =
                         (uint)bVar109 * auVar175._12_4_ | (uint)!bVar109 * auVar184._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar182._16_4_ =
                         (uint)bVar109 * auVar175._16_4_ | (uint)!bVar109 * auVar184._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar182._20_4_ =
                         (uint)bVar109 * auVar175._20_4_ | (uint)!bVar109 * auVar184._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar182._24_4_ =
                         (uint)bVar109 * auVar175._24_4_ | (uint)!bVar109 * auVar184._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar182._28_4_ =
                         (uint)bVar109 * auVar175._28_4_ | (uint)!bVar109 * auVar184._28_4_;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar182,auVar226);
                    auVar63._8_4_ = 0x395e8083;
                    auVar63._0_8_ = 0x395e8083395e8083;
                    auVar63._12_4_ = 0x395e8083;
                    auVar63._16_4_ = 0x395e8083;
                    auVar63._20_4_ = 0x395e8083;
                    auVar63._24_4_ = 0x395e8083;
                    auVar63._28_4_ = 0x395e8083;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar182,auVar63);
                    auVar241._0_4_ = auVar183._0_4_ * auVar183._0_4_;
                    auVar241._4_4_ = auVar183._4_4_ * auVar183._4_4_;
                    auVar241._8_4_ = auVar183._8_4_ * auVar183._8_4_;
                    auVar241._12_4_ = auVar183._12_4_ * auVar183._12_4_;
                    auVar241._16_4_ = auVar183._16_4_ * auVar183._16_4_;
                    auVar241._20_4_ = auVar183._20_4_ * auVar183._20_4_;
                    auVar241._24_4_ = auVar183._24_4_ * auVar183._24_4_;
                    auVar241._28_4_ = 0;
                    auVar110 = vfmadd213ps_fma(auVar152,auVar183,auVar266);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar271);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar277);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar283);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar214);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar241,auVar183);
                    auVar242._0_4_ = auVar110._0_4_ + 1.0;
                    auVar242._4_4_ = auVar110._4_4_ + 1.0;
                    auVar242._8_4_ = auVar110._8_4_ + 1.0;
                    auVar242._12_4_ = auVar110._12_4_ + 1.0;
                    auVar242._16_4_ = 0x3f800000;
                    auVar242._20_4_ = 0x3f800000;
                    auVar242._24_4_ = 0x3f800000;
                    auVar242._28_4_ = 0x3f800000;
                    auVar183 = vcvttps2dq_avx512vl(auVar182);
                    auVar183 = vpslld_avx2(auVar183,0x17);
                    auVar183 = vpaddd_avx2(auVar289,auVar183);
                    auVar110 = vfmadd213ps_fma(auVar183,auVar242,auVar222);
                    auVar183 = vrcpps_avx(ZEXT1632(auVar110));
                    auVar110 = vfmsub213ps_fma(ZEXT1632(auVar110),auVar183,auVar222);
                    auVar110 = vfnmadd132ps_fma(ZEXT1632(auVar110),auVar183,auVar183);
                    auVar183 = ZEXT1632(auVar110);
                    break;
                  case 5:
                    auVar183 = vminps_avx(auVar183,auVar205);
                    auVar183 = vmaxps_avx(auVar183,auVar210);
                    auVar110 = vfmadd213ps_fma(auVar218,auVar183,auVar214);
                    auVar175 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar175,1);
                    auVar176 = vsubps_avx512vl(auVar175,auVar222);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar177._0_4_ =
                         (uint)bVar109 * auVar176._0_4_ | (uint)!bVar109 * auVar175._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar177._4_4_ =
                         (uint)bVar109 * auVar176._4_4_ | (uint)!bVar109 * auVar175._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar177._8_4_ =
                         (uint)bVar109 * auVar176._8_4_ | (uint)!bVar109 * auVar175._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar177._12_4_ =
                         (uint)bVar109 * auVar176._12_4_ | (uint)!bVar109 * auVar175._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar177._16_4_ =
                         (uint)bVar109 * auVar176._16_4_ | (uint)!bVar109 * auVar175._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar177._20_4_ =
                         (uint)bVar109 * auVar176._20_4_ | (uint)!bVar109 * auVar175._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar177._24_4_ =
                         (uint)bVar109 * auVar176._24_4_ | (uint)!bVar109 * auVar175._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar177._28_4_ =
                         (uint)bVar109 * auVar176._28_4_ | (uint)!bVar109 * auVar175._28_4_;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar177,auVar226);
                    auVar183 = vfnmsub231ps_avx512vl(auVar183,auVar177,auVar295);
                    auVar258._0_4_ = auVar183._0_4_ * auVar183._0_4_;
                    auVar258._4_4_ = auVar183._4_4_ * auVar183._4_4_;
                    auVar258._8_4_ = auVar183._8_4_ * auVar183._8_4_;
                    auVar258._12_4_ = auVar183._12_4_ * auVar183._12_4_;
                    auVar258._16_4_ = auVar183._16_4_ * auVar183._16_4_;
                    auVar258._20_4_ = auVar183._20_4_ * auVar183._20_4_;
                    auVar258._24_4_ = auVar183._24_4_ * auVar183._24_4_;
                    auVar258._28_4_ = 0;
                    auVar175 = vfmadd213ps_avx512vl(auVar152,auVar183,auVar266);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar271);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar277);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar283);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar214);
                    auVar183 = vfmadd213ps_avx512vl(auVar175,auVar258,auVar183);
                    auVar175 = vaddps_avx512vl(auVar183,auVar222);
                    auVar183 = vcvttps2dq_avx512vl(auVar177);
                    auVar183 = vpslld_avx2(auVar183,0x17);
                    auVar183 = vpaddd_avx2(auVar183,auVar289);
                    auVar110 = vfmadd213ps_fma(auVar183,auVar175,auVar222);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar184,2);
                    auVar59._8_4_ = 0x800000;
                    auVar59._0_8_ = 0x80000000800000;
                    auVar59._12_4_ = 0x800000;
                    auVar59._16_4_ = 0x800000;
                    auVar59._20_4_ = 0x800000;
                    auVar59._24_4_ = 0x800000;
                    auVar59._28_4_ = 0x800000;
                    auVar183 = vmaxps_avx512vl(ZEXT1632(auVar110),auVar59);
                    auVar176 = vpsrld_avx2(auVar183,0x17);
                    auVar184 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar60._8_4_ = 0x3f000000;
                    auVar60._0_8_ = 0x3f0000003f000000;
                    auVar60._12_4_ = 0x3f000000;
                    auVar60._16_4_ = 0x3f000000;
                    auVar60._20_4_ = 0x3f000000;
                    auVar60._24_4_ = 0x3f000000;
                    auVar60._28_4_ = 0x3f000000;
                    auVar183 = vpternlogd_avx512vl(auVar183,auVar184,auVar60,0xea);
                    uVar89 = vcmpps_avx512vl(auVar183,auVar153,1);
                    auVar184 = vaddps_avx512vl(auVar183,auVar154);
                    auVar183 = vaddps_avx512vl(auVar184,auVar183);
                    bVar109 = (bool)((byte)uVar89 & 1);
                    auVar178._0_4_ =
                         (uint)bVar109 * auVar183._0_4_ | (uint)!bVar109 * auVar184._0_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar178._4_4_ =
                         (uint)bVar109 * auVar183._4_4_ | (uint)!bVar109 * auVar184._4_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar178._8_4_ =
                         (uint)bVar109 * auVar183._8_4_ | (uint)!bVar109 * auVar184._8_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar178._12_4_ =
                         (uint)bVar109 * auVar183._12_4_ | (uint)!bVar109 * auVar184._12_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar178._16_4_ =
                         (uint)bVar109 * auVar183._16_4_ | (uint)!bVar109 * auVar184._16_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar178._20_4_ =
                         (uint)bVar109 * auVar183._20_4_ | (uint)!bVar109 * auVar184._20_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar178._24_4_ =
                         (uint)bVar109 * auVar183._24_4_ | (uint)!bVar109 * auVar184._24_4_;
                    bVar109 = SUB81(uVar89 >> 7,0);
                    auVar178._28_4_ =
                         (uint)bVar109 * auVar183._28_4_ | (uint)!bVar109 * auVar184._28_4_;
                    auVar184 = vmulps_avx512vl(auVar178,auVar178);
                    auVar183 = vfmadd213ps_avx512vl(auVar155,auVar178,auVar156);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar157);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar158);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar159);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar160);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar161);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar162);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar178,auVar173);
                    auVar175 = vmulps_avx512vl(auVar184,auVar178);
                    auVar175 = vmulps_avx512vl(auVar175,auVar183);
                    auVar61._8_4_ = 0xffffff82;
                    auVar61._0_8_ = 0xffffff82ffffff82;
                    auVar61._12_4_ = 0xffffff82;
                    auVar61._16_4_ = 0xffffff82;
                    auVar61._20_4_ = 0xffffff82;
                    auVar61._24_4_ = 0xffffff82;
                    auVar61._28_4_ = 0xffffff82;
                    auVar183 = vpaddd_avx512vl(auVar176,auVar61);
                    auVar183 = vcvtdq2ps_avx(auVar183);
                    auVar176 = vsubps_avx512vl(auVar183,auVar222);
                    bVar109 = (bool)((byte)uVar89 & 1);
                    auVar179._0_4_ =
                         (uint)bVar109 * auVar176._0_4_ | (uint)!bVar109 * auVar183._0_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar179._4_4_ =
                         (uint)bVar109 * auVar176._4_4_ | (uint)!bVar109 * auVar183._4_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar179._8_4_ =
                         (uint)bVar109 * auVar176._8_4_ | (uint)!bVar109 * auVar183._8_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar179._12_4_ =
                         (uint)bVar109 * auVar176._12_4_ | (uint)!bVar109 * auVar183._12_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar179._16_4_ =
                         (uint)bVar109 * auVar176._16_4_ | (uint)!bVar109 * auVar183._16_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar179._20_4_ =
                         (uint)bVar109 * auVar176._20_4_ | (uint)!bVar109 * auVar183._20_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar179._24_4_ =
                         (uint)bVar109 * auVar176._24_4_ | (uint)!bVar109 * auVar183._24_4_;
                    bVar109 = SUB81(uVar89 >> 7,0);
                    auVar179._28_4_ =
                         (uint)bVar109 * auVar176._28_4_ | (uint)!bVar109 * auVar183._28_4_;
                    auVar183 = vfmadd231ps_avx512vl(auVar175,auVar179,auVar295);
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar214,auVar184);
                    auVar183 = vsubps_avx512vl(auVar183,auVar178);
                    auVar110 = vfmsub231ps_fma(auVar183,auVar226,auVar179);
                    auVar183 = vmulps_avx512vl(ZEXT1632(auVar110),auVar174);
                    auVar184 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar180._0_4_ =
                         (uint)bVar109 * auVar184._0_4_ | (uint)!bVar109 * auVar183._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar180._4_4_ =
                         (uint)bVar109 * auVar184._4_4_ | (uint)!bVar109 * auVar183._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar180._8_4_ =
                         (uint)bVar109 * auVar184._8_4_ | (uint)!bVar109 * auVar183._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar180._12_4_ =
                         (uint)bVar109 * auVar184._12_4_ | (uint)!bVar109 * auVar183._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar180._16_4_ =
                         (uint)bVar109 * auVar184._16_4_ | (uint)!bVar109 * auVar183._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar180._20_4_ =
                         (uint)bVar109 * auVar184._20_4_ | (uint)!bVar109 * auVar183._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar180._24_4_ =
                         (uint)bVar109 * auVar184._24_4_ | (uint)!bVar109 * auVar183._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar180._28_4_ =
                         (uint)bVar109 * auVar184._28_4_ | (uint)!bVar109 * auVar183._28_4_;
                    auVar183 = vminps_avx(auVar180,auVar205);
                    auVar183 = vmaxps_avx(auVar183,auVar210);
                    auVar110 = vfmadd213ps_fma(auVar218,auVar183,auVar214);
                    auVar184 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar184,1);
                    auVar175 = vsubps_avx512vl(auVar184,auVar222);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar181._0_4_ =
                         (uint)bVar109 * auVar175._0_4_ | (uint)!bVar109 * auVar184._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar181._4_4_ =
                         (uint)bVar109 * auVar175._4_4_ | (uint)!bVar109 * auVar184._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar181._8_4_ =
                         (uint)bVar109 * auVar175._8_4_ | (uint)!bVar109 * auVar184._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar181._12_4_ =
                         (uint)bVar109 * auVar175._12_4_ | (uint)!bVar109 * auVar184._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar181._16_4_ =
                         (uint)bVar109 * auVar175._16_4_ | (uint)!bVar109 * auVar184._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar181._20_4_ =
                         (uint)bVar109 * auVar175._20_4_ | (uint)!bVar109 * auVar184._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar181._24_4_ =
                         (uint)bVar109 * auVar175._24_4_ | (uint)!bVar109 * auVar184._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar181._28_4_ =
                         (uint)bVar109 * auVar175._28_4_ | (uint)!bVar109 * auVar184._28_4_;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar181,auVar226);
                    auVar183 = vfnmsub231ps_avx512vl(auVar183,auVar181,auVar295);
                    auVar259._0_4_ = auVar183._0_4_ * auVar183._0_4_;
                    auVar259._4_4_ = auVar183._4_4_ * auVar183._4_4_;
                    auVar259._8_4_ = auVar183._8_4_ * auVar183._8_4_;
                    auVar259._12_4_ = auVar183._12_4_ * auVar183._12_4_;
                    auVar259._16_4_ = auVar183._16_4_ * auVar183._16_4_;
                    auVar259._20_4_ = auVar183._20_4_ * auVar183._20_4_;
                    auVar259._24_4_ = auVar183._24_4_ * auVar183._24_4_;
                    auVar259._28_4_ = 0;
                    auVar184 = vfmadd213ps_avx512vl(auVar152,auVar183,auVar266);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar271);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar277);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar283);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar214);
                    auVar183 = vfmadd213ps_avx512vl(auVar184,auVar259,auVar183);
                    auVar184 = vaddps_avx512vl(auVar183,auVar222);
                    auVar183 = vcvttps2dq_avx512vl(auVar181);
                    auVar183 = vpslld_avx2(auVar183,0x17);
                    auVar183 = vpaddd_avx2(auVar183,auVar289);
                    auVar110 = vfmadd213ps_fma(auVar183,auVar184,auVar222);
                    auVar183 = vrcpps_avx(ZEXT1632(auVar110));
                    auVar110 = vfmsub213ps_fma(ZEXT1632(auVar110),auVar183,auVar222);
                    auVar110 = vfnmadd132ps_fma(ZEXT1632(auVar110),auVar183,auVar183);
                    auVar183 = vfnmadd213ps_avx512vl(ZEXT1632(auVar110),auVar174,auVar154);
                    auVar199._0_4_ = auVar183._0_4_ * auVar196._0_4_;
                    auVar199._4_4_ = auVar183._4_4_ * auVar196._4_4_;
                    auVar199._8_4_ = auVar183._8_4_ * auVar196._8_4_;
                    auVar199._12_4_ = auVar183._12_4_ * auVar196._12_4_;
                    auVar199._16_4_ = auVar183._16_4_ * auVar196._16_4_;
                    auVar199._20_4_ = auVar183._20_4_ * auVar196._20_4_;
                    auVar199._24_4_ = auVar183._24_4_ * auVar196._24_4_;
                    auVar183 = auVar199._0_32_;
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar243._4_4_ = uVar1;
                    auVar243._0_4_ = uVar1;
                    auVar243._8_4_ = uVar1;
                    auVar243._12_4_ = uVar1;
                    auVar243._16_4_ = uVar1;
                    auVar243._20_4_ = uVar1;
                    auVar243._24_4_ = uVar1;
                    auVar243._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar58._4_4_ = uVar1;
                    auVar58._0_4_ = uVar1;
                    auVar58._8_4_ = uVar1;
                    auVar58._12_4_ = uVar1;
                    auVar58._16_4_ = uVar1;
                    auVar58._20_4_ = uVar1;
                    auVar58._24_4_ = uVar1;
                    auVar58._28_4_ = uVar1;
                    auVar183 = vfmadd213ps_avx512vl(auVar243,auVar183,auVar58);
                    auVar183 = vmaxps_avx(auVar183,auVar184);
                    auVar183 = vminps_avx(auVar183,auVar222);
                    auVar200._0_4_ = auVar183._0_4_ * auVar196._0_4_;
                    auVar200._4_4_ = auVar183._4_4_ * auVar196._4_4_;
                    auVar200._8_4_ = auVar183._8_4_ * auVar196._8_4_;
                    auVar200._12_4_ = auVar183._12_4_ * auVar196._12_4_;
                    auVar200._16_4_ = auVar183._16_4_ * auVar196._16_4_;
                    auVar200._20_4_ = auVar183._20_4_ * auVar196._20_4_;
                    auVar200._24_4_ = auVar183._24_4_ * auVar196._24_4_;
                    auVar200._28_36_ = auVar199._28_36_;
                    auVar183 = auVar200._0_32_;
                  }
                }
                *pauVar92 = auVar183;
                pauVar92 = pauVar92 + 1;
                bVar109 = iVar104 != iVar5;
                iVar104 = iVar104 + 1;
              } while (bVar109);
            }
            local_150 = local_150 + 1;
          } while (local_150 != (uVar11 & 0xffffffff));
        }
        if ((local_100 == 0 && uVar4 == 4) && 0 < iVar79) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          auVar206._8_4_ = 0x42b0c0a5;
          auVar206._0_8_ = 0x42b0c0a542b0c0a5;
          auVar206._12_4_ = 0x42b0c0a5;
          auVar206._16_4_ = 0x42b0c0a5;
          auVar206._20_4_ = 0x42b0c0a5;
          auVar206._24_4_ = 0x42b0c0a5;
          auVar206._28_4_ = 0x42b0c0a5;
          auVar211._8_4_ = 0xc2b0c0a5;
          auVar211._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar211._12_4_ = 0xc2b0c0a5;
          auVar211._16_4_ = 0xc2b0c0a5;
          auVar211._20_4_ = 0xc2b0c0a5;
          auVar211._24_4_ = 0xc2b0c0a5;
          auVar211._28_4_ = 0xc2b0c0a5;
          auVar215._8_4_ = 0x3f000000;
          auVar215._0_8_ = 0x3f0000003f000000;
          auVar215._12_4_ = 0x3f000000;
          auVar215._16_4_ = 0x3f000000;
          auVar215._20_4_ = 0x3f000000;
          auVar215._24_4_ = 0x3f000000;
          auVar215._28_4_ = 0x3f000000;
          auVar219._8_4_ = 0x3fb8aa3b;
          auVar219._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar219._12_4_ = 0x3fb8aa3b;
          auVar219._16_4_ = 0x3fb8aa3b;
          auVar219._20_4_ = 0x3fb8aa3b;
          auVar219._24_4_ = 0x3fb8aa3b;
          auVar219._28_4_ = 0x3fb8aa3b;
          auVar223._8_4_ = 0x3f800000;
          auVar223._0_8_ = 0x3f8000003f800000;
          auVar223._12_4_ = 0x3f800000;
          auVar223._16_4_ = 0x3f800000;
          auVar223._20_4_ = 0x3f800000;
          auVar223._24_4_ = 0x3f800000;
          auVar223._28_4_ = 0x3f800000;
          auVar227._8_4_ = 0x3f318000;
          auVar227._0_8_ = 0x3f3180003f318000;
          auVar227._12_4_ = 0x3f318000;
          auVar227._16_4_ = 0x3f318000;
          auVar227._20_4_ = 0x3f318000;
          auVar227._24_4_ = 0x3f318000;
          auVar227._28_4_ = 0x3f318000;
          auVar152 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar267._8_4_ = 0x3ab743ce;
          auVar267._0_8_ = 0x3ab743ce3ab743ce;
          auVar267._12_4_ = 0x3ab743ce;
          auVar267._16_4_ = 0x3ab743ce;
          auVar267._20_4_ = 0x3ab743ce;
          auVar267._24_4_ = 0x3ab743ce;
          auVar267._28_4_ = 0x3ab743ce;
          auVar272._8_4_ = 0x3c088908;
          auVar272._0_8_ = 0x3c0889083c088908;
          auVar272._12_4_ = 0x3c088908;
          auVar272._16_4_ = 0x3c088908;
          auVar272._20_4_ = 0x3c088908;
          auVar272._24_4_ = 0x3c088908;
          auVar272._28_4_ = 0x3c088908;
          auVar278._8_4_ = 0x3d2aa9c1;
          auVar278._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar278._12_4_ = 0x3d2aa9c1;
          auVar278._16_4_ = 0x3d2aa9c1;
          auVar278._20_4_ = 0x3d2aa9c1;
          auVar278._24_4_ = 0x3d2aa9c1;
          auVar278._28_4_ = 0x3d2aa9c1;
          auVar284._8_4_ = 0x3e2aaaaa;
          auVar284._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar284._12_4_ = 0x3e2aaaaa;
          auVar284._16_4_ = 0x3e2aaaaa;
          auVar284._20_4_ = 0x3e2aaaaa;
          auVar284._24_4_ = 0x3e2aaaaa;
          auVar284._28_4_ = 0x3e2aaaaa;
          auVar290._8_4_ = 0x3f800000;
          auVar290._0_8_ = 0x3f8000003f800000;
          auVar290._12_4_ = 0x3f800000;
          auVar290._16_4_ = 0x3f800000;
          auVar290._20_4_ = 0x3f800000;
          auVar290._24_4_ = 0x3f800000;
          auVar290._28_4_ = 0x3f800000;
          auVar296._8_4_ = 0xb95e8083;
          auVar296._0_8_ = 0xb95e8083b95e8083;
          auVar296._12_4_ = 0xb95e8083;
          auVar296._16_4_ = 0xb95e8083;
          auVar296._20_4_ = 0xb95e8083;
          auVar296._24_4_ = 0xb95e8083;
          auVar296._28_4_ = 0xb95e8083;
          auVar153 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar154 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar160 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar173 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar174 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          do {
            if (-1 < iVar5) {
              pauVar92 = (undefined1 (*) [32])
                         ((long)top_blob->w * local_158 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar98 = 0;
              iVar104 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar196 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar196 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                       local_158 * 0x20));
                }
                if (0 < iVar78) {
                  pauVar106 = (undefined1 (*) [32])
                              ((this->weight_data_packed).cstep * local_158 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var6 = pp_Var8[-3];
                  iVar87 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  puVar99 = (uint *)((long)local_f8.data +
                                    (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar98) * 4
                                    + 0xc);
                  uVar97 = 0;
                  do {
                    if (0 < iVar87) {
                      puVar94 = puVar99;
                      pauVar80 = pauVar106;
                      iVar81 = iVar87;
                      do {
                        uVar2 = puVar94[-3];
                        auVar244._4_4_ = uVar2;
                        auVar244._0_4_ = uVar2;
                        auVar244._8_4_ = uVar2;
                        auVar244._12_4_ = uVar2;
                        auVar244._16_4_ = uVar2;
                        auVar244._20_4_ = uVar2;
                        auVar244._24_4_ = uVar2;
                        auVar244._28_4_ = uVar2;
                        uVar2 = puVar94[-2];
                        auVar260._4_4_ = uVar2;
                        auVar260._0_4_ = uVar2;
                        auVar260._8_4_ = uVar2;
                        auVar260._12_4_ = uVar2;
                        auVar260._16_4_ = uVar2;
                        auVar260._20_4_ = uVar2;
                        auVar260._24_4_ = uVar2;
                        auVar260._28_4_ = uVar2;
                        auVar183 = vbroadcastss_avx512vl(ZEXT416(puVar94[-1]));
                        auVar184 = vbroadcastss_avx512vl(ZEXT416(*puVar94));
                        auVar110 = vfmadd132ps_fma(auVar244,auVar196._0_32_,*pauVar80);
                        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar260,pauVar80[1]);
                        auVar183 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar183,pauVar80[2]);
                        auVar183 = vfmadd231ps_avx512vl(auVar183,auVar184,pauVar80[3]);
                        auVar196 = ZEXT3264(auVar183);
                        pauVar80 = pauVar80 + 4;
                        puVar94 = puVar94 + (*(int *)(&this->field_0xd8 + (long)p_Var6) << 2);
                        iVar81 = iVar81 + -1;
                      } while (iVar81 != 0);
                      pauVar106 = pauVar106 + (ulong)(iVar87 - 1) * 4 + 4;
                    }
                    uVar97 = uVar97 + 1;
                    puVar99 = (uint *)((long)puVar99 +
                                      (long)local_f8.w *
                                      CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize));
                  } while (uVar97 != uVar103);
                }
                auVar183 = auVar196._0_32_;
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar184 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar201._28_36_ = auVar196._28_36_;
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar183 = vmaxps_avx(auVar183,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar175 = vmaxps_avx(auVar183,auVar184);
                    auVar183 = vminps_avx(auVar183,auVar184);
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar75._4_4_ = uVar1;
                    auVar75._0_4_ = uVar1;
                    auVar75._8_4_ = uVar1;
                    auVar75._12_4_ = uVar1;
                    auVar75._16_4_ = uVar1;
                    auVar75._20_4_ = uVar1;
                    auVar75._24_4_ = uVar1;
                    auVar75._28_4_ = uVar1;
                    auVar183 = vfmadd132ps_avx512vl(auVar183,auVar175,auVar75);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar73._4_4_ = uVar1;
                    auVar73._0_4_ = uVar1;
                    auVar73._8_4_ = uVar1;
                    auVar73._12_4_ = uVar1;
                    auVar73._16_4_ = uVar1;
                    auVar73._20_4_ = uVar1;
                    auVar73._24_4_ = uVar1;
                    auVar73._28_4_ = uVar1;
                    auVar183 = vmaxps_avx512vl(auVar183,auVar73);
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar74._4_4_ = uVar1;
                    auVar74._0_4_ = uVar1;
                    auVar74._8_4_ = uVar1;
                    auVar74._12_4_ = uVar1;
                    auVar74._16_4_ = uVar1;
                    auVar74._20_4_ = uVar1;
                    auVar74._24_4_ = uVar1;
                    auVar74._28_4_ = uVar1;
                    auVar183 = vminps_avx512vl(auVar183,auVar74);
                    break;
                  case 4:
                    auVar71._8_4_ = 0x80000000;
                    auVar71._0_8_ = 0x8000000080000000;
                    auVar71._12_4_ = 0x80000000;
                    auVar71._16_4_ = 0x80000000;
                    auVar71._20_4_ = 0x80000000;
                    auVar71._24_4_ = 0x80000000;
                    auVar71._28_4_ = 0x80000000;
                    auVar183 = vxorps_avx512vl(auVar183,auVar71);
                    auVar183 = vminps_avx(auVar183,auVar206);
                    auVar183 = vmaxps_avx(auVar183,auVar211);
                    auVar110 = vfmadd231ps_fma(auVar215,auVar183,auVar219);
                    auVar184 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar184,1);
                    auVar175 = vsubps_avx512vl(auVar184,auVar223);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar190._0_4_ =
                         (uint)bVar109 * auVar175._0_4_ | (uint)!bVar109 * auVar184._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar190._4_4_ =
                         (uint)bVar109 * auVar175._4_4_ | (uint)!bVar109 * auVar184._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar190._8_4_ =
                         (uint)bVar109 * auVar175._8_4_ | (uint)!bVar109 * auVar184._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar190._12_4_ =
                         (uint)bVar109 * auVar175._12_4_ | (uint)!bVar109 * auVar184._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar190._16_4_ =
                         (uint)bVar109 * auVar175._16_4_ | (uint)!bVar109 * auVar184._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar190._20_4_ =
                         (uint)bVar109 * auVar175._20_4_ | (uint)!bVar109 * auVar184._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar190._24_4_ =
                         (uint)bVar109 * auVar175._24_4_ | (uint)!bVar109 * auVar184._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar190._28_4_ =
                         (uint)bVar109 * auVar175._28_4_ | (uint)!bVar109 * auVar184._28_4_;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar190,auVar227);
                    auVar72._8_4_ = 0x395e8083;
                    auVar72._0_8_ = 0x395e8083395e8083;
                    auVar72._12_4_ = 0x395e8083;
                    auVar72._16_4_ = 0x395e8083;
                    auVar72._20_4_ = 0x395e8083;
                    auVar72._24_4_ = 0x395e8083;
                    auVar72._28_4_ = 0x395e8083;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar190,auVar72);
                    auVar245._0_4_ = auVar183._0_4_ * auVar183._0_4_;
                    auVar245._4_4_ = auVar183._4_4_ * auVar183._4_4_;
                    auVar245._8_4_ = auVar183._8_4_ * auVar183._8_4_;
                    auVar245._12_4_ = auVar183._12_4_ * auVar183._12_4_;
                    auVar245._16_4_ = auVar183._16_4_ * auVar183._16_4_;
                    auVar245._20_4_ = auVar183._20_4_ * auVar183._20_4_;
                    auVar245._24_4_ = auVar183._24_4_ * auVar183._24_4_;
                    auVar245._28_4_ = 0;
                    auVar110 = vfmadd213ps_fma(auVar152,auVar183,auVar267);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar272);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar278);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar284);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar183,auVar215);
                    auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar245,auVar183);
                    auVar246._0_4_ = auVar110._0_4_ + 1.0;
                    auVar246._4_4_ = auVar110._4_4_ + 1.0;
                    auVar246._8_4_ = auVar110._8_4_ + 1.0;
                    auVar246._12_4_ = auVar110._12_4_ + 1.0;
                    auVar246._16_4_ = 0x3f800000;
                    auVar246._20_4_ = 0x3f800000;
                    auVar246._24_4_ = 0x3f800000;
                    auVar246._28_4_ = 0x3f800000;
                    auVar183 = vcvttps2dq_avx512vl(auVar190);
                    auVar183 = vpslld_avx2(auVar183,0x17);
                    auVar183 = vpaddd_avx2(auVar290,auVar183);
                    auVar110 = vfmadd213ps_fma(auVar183,auVar246,auVar223);
                    auVar183 = vrcpps_avx(ZEXT1632(auVar110));
                    auVar110 = vfmsub213ps_fma(ZEXT1632(auVar110),auVar183,auVar223);
                    auVar110 = vfnmadd132ps_fma(ZEXT1632(auVar110),auVar183,auVar183);
                    auVar183 = ZEXT1632(auVar110);
                    break;
                  case 5:
                    auVar183 = vminps_avx(auVar183,auVar206);
                    auVar183 = vmaxps_avx(auVar183,auVar211);
                    auVar110 = vfmadd213ps_fma(auVar219,auVar183,auVar215);
                    auVar175 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar175,1);
                    auVar176 = vsubps_avx512vl(auVar175,auVar223);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar185._0_4_ =
                         (uint)bVar109 * auVar176._0_4_ | (uint)!bVar109 * auVar175._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar185._4_4_ =
                         (uint)bVar109 * auVar176._4_4_ | (uint)!bVar109 * auVar175._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar185._8_4_ =
                         (uint)bVar109 * auVar176._8_4_ | (uint)!bVar109 * auVar175._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar185._12_4_ =
                         (uint)bVar109 * auVar176._12_4_ | (uint)!bVar109 * auVar175._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar185._16_4_ =
                         (uint)bVar109 * auVar176._16_4_ | (uint)!bVar109 * auVar175._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar185._20_4_ =
                         (uint)bVar109 * auVar176._20_4_ | (uint)!bVar109 * auVar175._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar185._24_4_ =
                         (uint)bVar109 * auVar176._24_4_ | (uint)!bVar109 * auVar175._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar185._28_4_ =
                         (uint)bVar109 * auVar176._28_4_ | (uint)!bVar109 * auVar175._28_4_;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar185,auVar227);
                    auVar183 = vfnmsub231ps_avx512vl(auVar183,auVar185,auVar296);
                    auVar261._0_4_ = auVar183._0_4_ * auVar183._0_4_;
                    auVar261._4_4_ = auVar183._4_4_ * auVar183._4_4_;
                    auVar261._8_4_ = auVar183._8_4_ * auVar183._8_4_;
                    auVar261._12_4_ = auVar183._12_4_ * auVar183._12_4_;
                    auVar261._16_4_ = auVar183._16_4_ * auVar183._16_4_;
                    auVar261._20_4_ = auVar183._20_4_ * auVar183._20_4_;
                    auVar261._24_4_ = auVar183._24_4_ * auVar183._24_4_;
                    auVar261._28_4_ = 0;
                    auVar175 = vfmadd213ps_avx512vl(auVar152,auVar183,auVar267);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar272);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar278);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar284);
                    auVar175 = vfmadd213ps_avx512vl(auVar175,auVar183,auVar215);
                    auVar183 = vfmadd213ps_avx512vl(auVar175,auVar261,auVar183);
                    auVar175 = vaddps_avx512vl(auVar183,auVar223);
                    auVar183 = vcvttps2dq_avx512vl(auVar185);
                    auVar183 = vpslld_avx2(auVar183,0x17);
                    auVar183 = vpaddd_avx2(auVar183,auVar290);
                    auVar110 = vfmadd213ps_fma(auVar183,auVar175,auVar223);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar184,2);
                    auVar68._8_4_ = 0x800000;
                    auVar68._0_8_ = 0x80000000800000;
                    auVar68._12_4_ = 0x800000;
                    auVar68._16_4_ = 0x800000;
                    auVar68._20_4_ = 0x800000;
                    auVar68._24_4_ = 0x800000;
                    auVar68._28_4_ = 0x800000;
                    auVar183 = vmaxps_avx512vl(ZEXT1632(auVar110),auVar68);
                    auVar176 = vpsrld_avx2(auVar183,0x17);
                    auVar184 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar69._8_4_ = 0x3f000000;
                    auVar69._0_8_ = 0x3f0000003f000000;
                    auVar69._12_4_ = 0x3f000000;
                    auVar69._16_4_ = 0x3f000000;
                    auVar69._20_4_ = 0x3f000000;
                    auVar69._24_4_ = 0x3f000000;
                    auVar69._28_4_ = 0x3f000000;
                    auVar183 = vpternlogd_avx512vl(auVar183,auVar184,auVar69,0xea);
                    uVar89 = vcmpps_avx512vl(auVar183,auVar153,1);
                    auVar184 = vaddps_avx512vl(auVar183,auVar154);
                    auVar183 = vaddps_avx512vl(auVar184,auVar183);
                    bVar109 = (bool)((byte)uVar89 & 1);
                    auVar186._0_4_ =
                         (uint)bVar109 * auVar183._0_4_ | (uint)!bVar109 * auVar184._0_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar186._4_4_ =
                         (uint)bVar109 * auVar183._4_4_ | (uint)!bVar109 * auVar184._4_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar186._8_4_ =
                         (uint)bVar109 * auVar183._8_4_ | (uint)!bVar109 * auVar184._8_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar186._12_4_ =
                         (uint)bVar109 * auVar183._12_4_ | (uint)!bVar109 * auVar184._12_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar186._16_4_ =
                         (uint)bVar109 * auVar183._16_4_ | (uint)!bVar109 * auVar184._16_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar186._20_4_ =
                         (uint)bVar109 * auVar183._20_4_ | (uint)!bVar109 * auVar184._20_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar186._24_4_ =
                         (uint)bVar109 * auVar183._24_4_ | (uint)!bVar109 * auVar184._24_4_;
                    bVar109 = SUB81(uVar89 >> 7,0);
                    auVar186._28_4_ =
                         (uint)bVar109 * auVar183._28_4_ | (uint)!bVar109 * auVar184._28_4_;
                    auVar184 = vmulps_avx512vl(auVar186,auVar186);
                    auVar183 = vfmadd213ps_avx512vl(auVar155,auVar186,auVar156);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar157);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar158);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar159);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar160);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar161);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar162);
                    auVar183 = vfmadd213ps_avx512vl(auVar183,auVar186,auVar173);
                    auVar175 = vmulps_avx512vl(auVar184,auVar186);
                    auVar175 = vmulps_avx512vl(auVar175,auVar183);
                    auVar70._8_4_ = 0xffffff82;
                    auVar70._0_8_ = 0xffffff82ffffff82;
                    auVar70._12_4_ = 0xffffff82;
                    auVar70._16_4_ = 0xffffff82;
                    auVar70._20_4_ = 0xffffff82;
                    auVar70._24_4_ = 0xffffff82;
                    auVar70._28_4_ = 0xffffff82;
                    auVar183 = vpaddd_avx512vl(auVar176,auVar70);
                    auVar183 = vcvtdq2ps_avx(auVar183);
                    auVar176 = vsubps_avx512vl(auVar183,auVar223);
                    bVar109 = (bool)((byte)uVar89 & 1);
                    auVar187._0_4_ =
                         (uint)bVar109 * auVar176._0_4_ | (uint)!bVar109 * auVar183._0_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar187._4_4_ =
                         (uint)bVar109 * auVar176._4_4_ | (uint)!bVar109 * auVar183._4_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar187._8_4_ =
                         (uint)bVar109 * auVar176._8_4_ | (uint)!bVar109 * auVar183._8_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar187._12_4_ =
                         (uint)bVar109 * auVar176._12_4_ | (uint)!bVar109 * auVar183._12_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar187._16_4_ =
                         (uint)bVar109 * auVar176._16_4_ | (uint)!bVar109 * auVar183._16_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar187._20_4_ =
                         (uint)bVar109 * auVar176._20_4_ | (uint)!bVar109 * auVar183._20_4_;
                    bVar109 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar187._24_4_ =
                         (uint)bVar109 * auVar176._24_4_ | (uint)!bVar109 * auVar183._24_4_;
                    bVar109 = SUB81(uVar89 >> 7,0);
                    auVar187._28_4_ =
                         (uint)bVar109 * auVar176._28_4_ | (uint)!bVar109 * auVar183._28_4_;
                    auVar183 = vfmadd231ps_avx512vl(auVar175,auVar187,auVar296);
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar215,auVar184);
                    auVar183 = vsubps_avx512vl(auVar183,auVar186);
                    auVar110 = vfmsub231ps_fma(auVar183,auVar227,auVar187);
                    auVar183 = vmulps_avx512vl(ZEXT1632(auVar110),auVar174);
                    auVar184 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar188._0_4_ =
                         (uint)bVar109 * auVar184._0_4_ | (uint)!bVar109 * auVar183._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar188._4_4_ =
                         (uint)bVar109 * auVar184._4_4_ | (uint)!bVar109 * auVar183._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar188._8_4_ =
                         (uint)bVar109 * auVar184._8_4_ | (uint)!bVar109 * auVar183._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar188._12_4_ =
                         (uint)bVar109 * auVar184._12_4_ | (uint)!bVar109 * auVar183._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar188._16_4_ =
                         (uint)bVar109 * auVar184._16_4_ | (uint)!bVar109 * auVar183._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar188._20_4_ =
                         (uint)bVar109 * auVar184._20_4_ | (uint)!bVar109 * auVar183._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar188._24_4_ =
                         (uint)bVar109 * auVar184._24_4_ | (uint)!bVar109 * auVar183._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar188._28_4_ =
                         (uint)bVar109 * auVar184._28_4_ | (uint)!bVar109 * auVar183._28_4_;
                    auVar183 = vminps_avx(auVar188,auVar206);
                    auVar183 = vmaxps_avx(auVar183,auVar211);
                    auVar110 = vfmadd213ps_fma(auVar219,auVar183,auVar215);
                    auVar184 = vrndscaleps_avx512vl(ZEXT1632(auVar110),1);
                    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar184,1);
                    auVar175 = vsubps_avx512vl(auVar184,auVar223);
                    bVar109 = (bool)((byte)uVar97 & 1);
                    auVar189._0_4_ =
                         (uint)bVar109 * auVar175._0_4_ | (uint)!bVar109 * auVar184._0_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar189._4_4_ =
                         (uint)bVar109 * auVar175._4_4_ | (uint)!bVar109 * auVar184._4_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar189._8_4_ =
                         (uint)bVar109 * auVar175._8_4_ | (uint)!bVar109 * auVar184._8_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar189._12_4_ =
                         (uint)bVar109 * auVar175._12_4_ | (uint)!bVar109 * auVar184._12_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar189._16_4_ =
                         (uint)bVar109 * auVar175._16_4_ | (uint)!bVar109 * auVar184._16_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar189._20_4_ =
                         (uint)bVar109 * auVar175._20_4_ | (uint)!bVar109 * auVar184._20_4_;
                    bVar109 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar189._24_4_ =
                         (uint)bVar109 * auVar175._24_4_ | (uint)!bVar109 * auVar184._24_4_;
                    bVar109 = SUB81(uVar97 >> 7,0);
                    auVar189._28_4_ =
                         (uint)bVar109 * auVar175._28_4_ | (uint)!bVar109 * auVar184._28_4_;
                    auVar183 = vfmsub231ps_avx512vl(auVar183,auVar189,auVar227);
                    auVar183 = vfnmsub231ps_avx512vl(auVar183,auVar189,auVar296);
                    auVar262._0_4_ = auVar183._0_4_ * auVar183._0_4_;
                    auVar262._4_4_ = auVar183._4_4_ * auVar183._4_4_;
                    auVar262._8_4_ = auVar183._8_4_ * auVar183._8_4_;
                    auVar262._12_4_ = auVar183._12_4_ * auVar183._12_4_;
                    auVar262._16_4_ = auVar183._16_4_ * auVar183._16_4_;
                    auVar262._20_4_ = auVar183._20_4_ * auVar183._20_4_;
                    auVar262._24_4_ = auVar183._24_4_ * auVar183._24_4_;
                    auVar262._28_4_ = 0;
                    auVar184 = vfmadd213ps_avx512vl(auVar152,auVar183,auVar267);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar272);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar278);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar284);
                    auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar215);
                    auVar183 = vfmadd213ps_avx512vl(auVar184,auVar262,auVar183);
                    auVar184 = vaddps_avx512vl(auVar183,auVar223);
                    auVar183 = vcvttps2dq_avx512vl(auVar189);
                    auVar183 = vpslld_avx2(auVar183,0x17);
                    auVar183 = vpaddd_avx2(auVar183,auVar290);
                    auVar110 = vfmadd213ps_fma(auVar183,auVar184,auVar223);
                    auVar183 = vrcpps_avx(ZEXT1632(auVar110));
                    auVar110 = vfmsub213ps_fma(ZEXT1632(auVar110),auVar183,auVar223);
                    auVar110 = vfnmadd132ps_fma(ZEXT1632(auVar110),auVar183,auVar183);
                    auVar183 = vfnmadd213ps_avx512vl(ZEXT1632(auVar110),auVar174,auVar154);
                    auVar201._0_4_ = auVar183._0_4_ * auVar196._0_4_;
                    auVar201._4_4_ = auVar183._4_4_ * auVar196._4_4_;
                    auVar201._8_4_ = auVar183._8_4_ * auVar196._8_4_;
                    auVar201._12_4_ = auVar183._12_4_ * auVar196._12_4_;
                    auVar201._16_4_ = auVar183._16_4_ * auVar196._16_4_;
                    auVar201._20_4_ = auVar183._20_4_ * auVar196._20_4_;
                    auVar201._24_4_ = auVar183._24_4_ * auVar196._24_4_;
                    auVar183 = auVar201._0_32_;
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar247._4_4_ = uVar1;
                    auVar247._0_4_ = uVar1;
                    auVar247._8_4_ = uVar1;
                    auVar247._12_4_ = uVar1;
                    auVar247._16_4_ = uVar1;
                    auVar247._20_4_ = uVar1;
                    auVar247._24_4_ = uVar1;
                    auVar247._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar67._4_4_ = uVar1;
                    auVar67._0_4_ = uVar1;
                    auVar67._8_4_ = uVar1;
                    auVar67._12_4_ = uVar1;
                    auVar67._16_4_ = uVar1;
                    auVar67._20_4_ = uVar1;
                    auVar67._24_4_ = uVar1;
                    auVar67._28_4_ = uVar1;
                    auVar183 = vfmadd213ps_avx512vl(auVar247,auVar183,auVar67);
                    auVar183 = vmaxps_avx(auVar183,auVar184);
                    auVar183 = vminps_avx(auVar183,auVar223);
                    auVar202._0_4_ = auVar183._0_4_ * auVar196._0_4_;
                    auVar202._4_4_ = auVar183._4_4_ * auVar196._4_4_;
                    auVar202._8_4_ = auVar183._8_4_ * auVar196._8_4_;
                    auVar202._12_4_ = auVar183._12_4_ * auVar196._12_4_;
                    auVar202._16_4_ = auVar183._16_4_ * auVar196._16_4_;
                    auVar202._20_4_ = auVar183._20_4_ * auVar196._20_4_;
                    auVar202._24_4_ = auVar183._24_4_ * auVar196._24_4_;
                    auVar202._28_36_ = auVar201._28_36_;
                    auVar183 = auVar202._0_32_;
                  }
                }
                *pauVar92 = auVar183;
                pauVar92 = pauVar92 + 1;
                iVar98 = iVar98 + 4;
                bVar109 = iVar104 != iVar5;
                iVar104 = iVar104 + 1;
              } while (bVar109);
            }
            local_158 = local_158 + 1;
          } while (local_158 != (uVar11 & 0xffffffff));
        }
        local_ac = uVar82 ^ 1;
        if ((local_ac == 0 && local_b0 == 0) && 0 < iVar79) {
          local_90 = top_blob->data;
          local_98 = (long)top_blob->w * top_blob->elemsize;
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_a0 = (this->weight_data_packed).data;
          local_a8 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
          local_88 = uVar11 & 0xffffffff;
          local_158 = 0;
          do {
            pvVar77 = local_90;
            pvVar9 = local_f8.data;
            if (-1 < iVar5) {
              lVar83 = local_98 * local_158;
              pauVar92 = (undefined1 (*) [32])(local_a8 * local_158 + (long)local_a0);
              lVar108 = (long)local_f8.w;
              lVar91 = CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize);
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar104 = 0;
              uVar97 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  fVar192 = 0.0;
                }
                else {
                  fVar192 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var6) + local_158 * 4)
                  ;
                }
                if (iVar78 < 1) {
                  auVar152 = SUB6432(ZEXT864(0),0);
                }
                else {
                  p_Var6 = pp_Var8[-3];
                  iVar98 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  pauVar106 = (undefined1 (*) [32])
                              ((long)pvVar9 +
                              (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar104) * 4);
                  auVar196 = ZEXT864(0);
                  uVar89 = 0;
                  pauVar80 = pauVar92;
                  do {
                    if (0 < iVar98) {
                      pauVar93 = pauVar80;
                      pauVar100 = pauVar106;
                      iVar87 = iVar98;
                      do {
                        auVar110 = vfmadd231ps_fma(auVar196._0_32_,*pauVar93,*pauVar100);
                        auVar196 = ZEXT1664(auVar110);
                        pauVar93 = pauVar93 + 1;
                        pauVar100 = (undefined1 (*) [32])
                                    (*pauVar100 +
                                    (long)(*(int *)(&this->field_0xd8 + (long)p_Var6) << 3) * 4);
                        iVar87 = iVar87 + -1;
                      } while (iVar87 != 0);
                      pauVar80 = pauVar80 + (ulong)(iVar98 - 1) + 1;
                    }
                    auVar152 = auVar196._0_32_;
                    uVar89 = uVar89 + 1;
                    pauVar106 = (undefined1 (*) [32])(*pauVar106 + lVar108 * lVar91);
                  } while (uVar89 != uVar103);
                }
                auVar111._0_4_ = auVar152._16_4_ + auVar152._0_4_;
                auVar111._4_4_ = auVar152._20_4_ + auVar152._4_4_;
                auVar111._8_4_ = auVar152._24_4_ + auVar152._8_4_;
                auVar111._12_4_ = auVar152._28_4_ + auVar152._12_4_;
                auVar110 = vshufpd_avx(auVar111,auVar111,1);
                auVar112._0_4_ = auVar110._0_4_ + auVar111._0_4_;
                auVar112._4_4_ = auVar110._4_4_ + auVar111._4_4_;
                auVar112._8_4_ = auVar110._8_4_ + auVar111._8_4_;
                auVar112._12_4_ = auVar110._12_4_ + auVar111._12_4_;
                auVar110 = vmovshdup_avx(auVar112);
                fVar192 = auVar110._0_4_ + fVar192 + auVar112._0_4_;
                p_Var6 = pp_Var7[-3];
                fVar191 = fVar192;
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar110 = ZEXT416((uint)fVar192);
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar110 = vmaxss_avx(auVar110,ZEXT416(0));
                    fVar191 = auVar110._0_4_;
                    break;
                  case 2:
                    uVar12 = vcmpss_avx512f(auVar110,ZEXT416(0),0xe);
                    bVar109 = (bool)((byte)uVar12 & 1);
                    fVar191 = (float)((uint)bVar109 * 0x3f800000 +
                                     (uint)!bVar109 * **(int **)(&this->field_0xf8 + (long)p_Var6))
                              * fVar192;
                    break;
                  case 3:
                    fVar192 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar110 = vmaxss_avx(auVar110,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                      (long)p_Var6)));
                    fVar191 = auVar110._0_4_;
                    if (fVar192 < auVar110._0_4_) {
                      fVar191 = fVar192;
                    }
                    break;
                  case 4:
                    auVar110 = vminss_avx(auVar110,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar113._8_4_ = 0x80000000;
                    auVar113._0_8_ = 0x8000000080000000;
                    auVar113._12_4_ = 0x80000000;
                    auVar111 = vxorps_avx512vl(auVar110,auVar113);
                    uVar12 = vcmpss_avx512f(auVar110,ZEXT416(0xc2b0c0a5),1);
                    bVar109 = (bool)((byte)uVar12 & 1);
                    fVar192 = expf((float)((uint)bVar109 * 0x42b0c0a5 +
                                          (uint)!bVar109 * auVar111._0_4_));
                    fVar191 = 1.0 / (fVar192 + 1.0);
                    break;
                  case 5:
                    fVar191 = expf(fVar192);
                    fVar191 = logf(fVar191 + 1.0);
                    fVar191 = tanhf(fVar191);
                    fVar191 = fVar191 * fVar192;
                    break;
                  case 6:
                    fVar3 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                    auVar110._8_4_ = 0x80000000;
                    auVar110._0_8_ = 0x8000000080000000;
                    auVar110._12_4_ = 0x80000000;
                    auVar111 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var6))[1]);
                    auVar110 = vxorps_avx512vl(auVar111,auVar110);
                    fVar207 = auVar110._0_4_ / fVar3;
                    fVar191 = 0.0;
                    if ((fVar207 <= fVar192) &&
                       (fVar191 = fVar192, fVar192 <= fVar207 + 1.0 / fVar3)) {
                      auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar192),
                                                 auVar111);
                      fVar191 = auVar110._0_4_ * fVar192;
                    }
                  }
                }
                *(float *)((long)pvVar77 + uVar97 * 4 + lVar83) = fVar191;
                uVar97 = uVar97 + 1;
                iVar104 = iVar104 + 8;
              } while (uVar97 != local_80);
            }
            local_158 = local_158 + 1;
          } while (local_158 != local_88);
        }
        uVar82 = uVar82 ^ 4;
        local_b0 = local_b0 | uVar82;
        if (local_b0 == 0 && 0 < iVar79) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          auVar133 = ZEXT816(0) << 0x40;
          auVar134._8_4_ = 0x42b0c0a5;
          auVar134._0_8_ = 0x42b0c0a542b0c0a5;
          auVar134._12_4_ = 0x42b0c0a5;
          auVar135._8_4_ = 0xc2b0c0a5;
          auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar135._12_4_ = 0xc2b0c0a5;
          auVar193._8_4_ = 0x3f000000;
          auVar193._0_8_ = 0x3f0000003f000000;
          auVar193._12_4_ = 0x3f000000;
          auVar136._8_4_ = 0x3fb8aa3b;
          auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar136._12_4_ = 0x3fb8aa3b;
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = 0x3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          auVar138._8_4_ = 0x3f318000;
          auVar138._0_8_ = 0x3f3180003f318000;
          auVar138._12_4_ = 0x3f318000;
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar137._8_4_ = 0x3ab743ce;
          auVar137._0_8_ = 0x3ab743ce3ab743ce;
          auVar137._12_4_ = 0x3ab743ce;
          auVar252._8_4_ = 0x3c088908;
          auVar252._0_8_ = 0x3c0889083c088908;
          auVar252._12_4_ = 0x3c088908;
          auVar273._8_4_ = 0x3d2aa9c1;
          auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar273._12_4_ = 0x3d2aa9c1;
          auVar279._8_4_ = 0x3e2aaaaa;
          auVar279._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar279._12_4_ = 0x3e2aaaaa;
          auVar285._8_4_ = 0x3f800000;
          auVar285._0_8_ = 0x3f8000003f800000;
          auVar285._12_4_ = 0x3f800000;
          auVar291._8_4_ = 0xb95e8083;
          auVar291._0_8_ = 0xb95e8083b95e8083;
          auVar291._12_4_ = 0xb95e8083;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < iVar5) {
              pauVar90 = (undefined1 (*) [16])
                         ((long)top_blob->w * local_158 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar98 = 0;
              iVar104 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar126 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar126 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x190 + (long)p_Var6) + local_158 * 0x10);
                }
                auVar196 = ZEXT1664(auVar126);
                if (0 < iVar78) {
                  pauVar107 = (undefined1 (*) [16])
                              ((this->weight_data_packed).cstep * local_158 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var6 = pp_Var8[-3];
                  iVar87 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  puVar99 = (uint *)((long)local_f8.data +
                                    (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar98) * 4
                                    + 0x1c);
                  uVar97 = 0;
                  do {
                    if (0 < iVar87) {
                      puVar94 = puVar99;
                      pauVar101 = pauVar107;
                      iVar81 = iVar87;
                      do {
                        uVar2 = puVar94[-7];
                        auVar126._4_4_ = uVar2;
                        auVar126._0_4_ = uVar2;
                        auVar126._8_4_ = uVar2;
                        auVar126._12_4_ = uVar2;
                        uVar2 = puVar94[-6];
                        auVar248._4_4_ = uVar2;
                        auVar248._0_4_ = uVar2;
                        auVar248._8_4_ = uVar2;
                        auVar248._12_4_ = uVar2;
                        auVar120 = vbroadcastss_avx512vl(ZEXT416(puVar94[-5]));
                        auVar121 = vbroadcastss_avx512vl(ZEXT416(puVar94[-4]));
                        auVar122 = vbroadcastss_avx512vl(ZEXT416(puVar94[-3]));
                        auVar123 = vbroadcastss_avx512vl(ZEXT416(puVar94[-2]));
                        auVar124 = vbroadcastss_avx512vl(ZEXT416(puVar94[-1]));
                        auVar125 = vbroadcastss_avx512vl(ZEXT416(*puVar94));
                        auVar126 = vfmadd132ps_fma(auVar126,auVar196._0_16_,*pauVar101);
                        auVar126 = vfmadd231ps_fma(auVar126,auVar248,pauVar101[1]);
                        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar120,pauVar101[2]);
                        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar121,pauVar101[3]);
                        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar122,pauVar101[4]);
                        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar123,pauVar101[5]);
                        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar124,pauVar101[6]);
                        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,pauVar101[7]);
                        auVar196 = ZEXT1664(auVar126);
                        pauVar101 = pauVar101 + 8;
                        puVar94 = puVar94 + (*(int *)(&this->field_0xd8 + (long)p_Var6) << 3);
                        iVar81 = iVar81 + -1;
                      } while (iVar81 != 0);
                      pauVar107 = pauVar107 + (ulong)(iVar87 - 1) * 8 + 8;
                    }
                    auVar126 = auVar196._0_16_;
                    uVar97 = uVar97 + 1;
                    puVar99 = (uint *)((long)puVar99 +
                                      (long)local_f8.w *
                                      CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize));
                  } while (uVar97 != uVar103);
                }
                p_Var6 = pp_Var7[-3];
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar126 = vmaxps_avx(auVar126,auVar133);
                  break;
                case 2:
                  auVar120 = vmaxps_avx(auVar126,auVar133);
                  auVar126 = vminps_avx(auVar126,auVar133);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar24._4_4_ = uVar1;
                  auVar24._0_4_ = uVar1;
                  auVar24._8_4_ = uVar1;
                  auVar24._12_4_ = uVar1;
                  auVar126 = vfmadd132ps_avx512vl(auVar126,auVar120,auVar24);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar22._4_4_ = uVar1;
                  auVar22._0_4_ = uVar1;
                  auVar22._8_4_ = uVar1;
                  auVar22._12_4_ = uVar1;
                  auVar126 = vmaxps_avx512vl(auVar126,auVar22);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar23._4_4_ = uVar1;
                  auVar23._0_4_ = uVar1;
                  auVar23._8_4_ = uVar1;
                  auVar23._12_4_ = uVar1;
                  auVar126 = vminps_avx512vl(auVar126,auVar23);
                  break;
                case 4:
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar126 = vxorps_avx512vl(auVar126,auVar20);
                  auVar126 = vminps_avx(auVar126,auVar134);
                  auVar126 = vmaxps_avx(auVar126,auVar135);
                  auVar120 = vfmadd231ps_fma(auVar193,auVar126,auVar136);
                  auVar121 = vcvttps2dq_avx512vl(auVar120);
                  auVar121 = vcvtdq2ps_avx512vl(auVar121);
                  uVar97 = vcmpps_avx512vl(auVar120,auVar121,1);
                  auVar120 = vsubps_avx512vl(auVar121,auVar145);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar132._0_4_ = (uint)bVar109 * auVar120._0_4_ | (uint)!bVar109 * auVar121._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar132._4_4_ = (uint)bVar109 * auVar120._4_4_ | (uint)!bVar109 * auVar121._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar132._8_4_ = (uint)bVar109 * auVar120._8_4_ | (uint)!bVar109 * auVar121._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar132._12_4_ =
                       (uint)bVar109 * auVar120._12_4_ | (uint)!bVar109 * auVar121._12_4_;
                  auVar126 = vfmsub231ps_avx512vl(auVar126,auVar132,auVar138);
                  auVar21._8_4_ = 0x395e8083;
                  auVar21._0_8_ = 0x395e8083395e8083;
                  auVar21._12_4_ = 0x395e8083;
                  auVar120 = vfmsub231ps_avx512vl(auVar126,auVar132,auVar21);
                  auVar228._0_4_ = auVar120._0_4_ * auVar120._0_4_;
                  auVar228._4_4_ = auVar120._4_4_ * auVar120._4_4_;
                  auVar228._8_4_ = auVar120._8_4_ * auVar120._8_4_;
                  auVar228._12_4_ = auVar120._12_4_ * auVar120._12_4_;
                  auVar126 = vfmadd213ps_fma(auVar110,auVar120,auVar137);
                  auVar126 = vfmadd213ps_fma(auVar126,auVar120,auVar252);
                  auVar126 = vfmadd213ps_fma(auVar126,auVar120,auVar273);
                  auVar126 = vfmadd213ps_fma(auVar126,auVar120,auVar279);
                  auVar126 = vfmadd213ps_fma(auVar126,auVar120,auVar193);
                  auVar126 = vfmadd213ps_fma(auVar126,auVar228,auVar120);
                  auVar229._0_4_ = auVar126._0_4_ + 1.0;
                  auVar229._4_4_ = auVar126._4_4_ + 1.0;
                  auVar229._8_4_ = auVar126._8_4_ + 1.0;
                  auVar229._12_4_ = auVar126._12_4_ + 1.0;
                  auVar126 = vcvttps2dq_avx512vl(auVar132);
                  auVar126 = vpslld_avx(auVar126,0x17);
                  auVar126 = vpaddd_avx(auVar285,auVar126);
                  auVar120 = vfmadd213ps_fma(auVar126,auVar229,auVar145);
                  auVar126 = vrcpps_avx(auVar120);
                  auVar120 = vfmsub213ps_fma(auVar120,auVar126,auVar145);
                  auVar126 = vfnmadd132ps_fma(auVar120,auVar126,auVar126);
                  break;
                case 5:
                  auVar120 = vminps_avx(auVar126,auVar134);
                  auVar120 = vmaxps_avx(auVar120,auVar135);
                  auVar121 = vfmadd213ps_fma(auVar136,auVar120,auVar193);
                  auVar122 = vcvttps2dq_avx512vl(auVar121);
                  auVar122 = vcvtdq2ps_avx512vl(auVar122);
                  uVar97 = vcmpps_avx512vl(auVar121,auVar122,1);
                  auVar121 = vsubps_avx512vl(auVar122,auVar145);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar127._0_4_ = (uint)bVar109 * auVar121._0_4_ | (uint)!bVar109 * auVar122._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar127._4_4_ = (uint)bVar109 * auVar121._4_4_ | (uint)!bVar109 * auVar122._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar127._8_4_ = (uint)bVar109 * auVar121._8_4_ | (uint)!bVar109 * auVar122._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar127._12_4_ =
                       (uint)bVar109 * auVar121._12_4_ | (uint)!bVar109 * auVar122._12_4_;
                  auVar120 = vfmsub231ps_avx512vl(auVar120,auVar127,auVar138);
                  auVar120 = vfnmsub231ps_avx512vl(auVar120,auVar127,auVar291);
                  auVar249._0_4_ = auVar120._0_4_ * auVar120._0_4_;
                  auVar249._4_4_ = auVar120._4_4_ * auVar120._4_4_;
                  auVar249._8_4_ = auVar120._8_4_ * auVar120._8_4_;
                  auVar249._12_4_ = auVar120._12_4_ * auVar120._12_4_;
                  auVar121 = vfmadd213ps_avx512vl(auVar110,auVar120,auVar137);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar252);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar273);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar279);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar193);
                  auVar120 = vfmadd213ps_avx512vl(auVar121,auVar249,auVar120);
                  auVar121 = vaddps_avx512vl(auVar120,auVar145);
                  auVar120 = vcvttps2dq_avx512vl(auVar127);
                  auVar120 = vpslld_avx(auVar120,0x17);
                  auVar120 = vpaddd_avx(auVar120,auVar285);
                  auVar120 = vfmadd213ps_fma(auVar120,auVar121,auVar145);
                  uVar97 = vcmpps_avx512vl(auVar120,auVar133,2);
                  auVar123._8_4_ = 0x800000;
                  auVar123._0_8_ = 0x80000000800000;
                  auVar123._12_4_ = 0x800000;
                  auVar120 = vmaxps_avx512vl(auVar120,auVar123);
                  auVar123 = vpsrld_avx(auVar120,0x17);
                  auVar121 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar124._8_4_ = 0x3f000000;
                  auVar124._0_8_ = 0x3f0000003f000000;
                  auVar124._12_4_ = 0x3f000000;
                  auVar120 = vpternlogd_avx512vl(auVar120,auVar121,auVar124,0xea);
                  auVar125._8_4_ = 0x3f3504f3;
                  auVar125._0_8_ = 0x3f3504f33f3504f3;
                  auVar125._12_4_ = 0x3f3504f3;
                  uVar89 = vcmpps_avx512vl(auVar120,auVar125,1);
                  auVar17._8_4_ = 0xbf800000;
                  auVar17._0_8_ = 0xbf800000bf800000;
                  auVar17._12_4_ = 0xbf800000;
                  auVar121 = vaddps_avx512vl(auVar120,auVar17);
                  auVar120 = vaddps_avx512vl(auVar121,auVar120);
                  bVar109 = (bool)((byte)uVar89 & 1);
                  auVar128._0_4_ = (uint)bVar109 * auVar120._0_4_ | (uint)!bVar109 * auVar121._0_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar128._4_4_ = (uint)bVar109 * auVar120._4_4_ | (uint)!bVar109 * auVar121._4_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar128._8_4_ = (uint)bVar109 * auVar120._8_4_ | (uint)!bVar109 * auVar121._8_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar128._12_4_ =
                       (uint)bVar109 * auVar120._12_4_ | (uint)!bVar109 * auVar121._12_4_;
                  auVar121 = vmulps_avx512vl(auVar128,auVar128);
                  auVar18._8_4_ = 0xbdebd1b8;
                  auVar18._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar18._12_4_ = 0xbdebd1b8;
                  auVar120 = vfmadd213ps_avx512vl(auVar111,auVar128,auVar18);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar112);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar113);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar114);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar115);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar116);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar117);
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar118);
                  auVar122 = vmulps_avx512vl(auVar121,auVar128);
                  auVar122 = vmulps_avx512vl(auVar122,auVar120);
                  auVar19._8_4_ = 0xffffff82;
                  auVar19._0_8_ = 0xffffff82ffffff82;
                  auVar19._12_4_ = 0xffffff82;
                  auVar120 = vpaddd_avx512vl(auVar123,auVar19);
                  auVar120 = vcvtdq2ps_avx(auVar120);
                  auVar123 = vsubps_avx512vl(auVar120,auVar145);
                  bVar109 = (bool)((byte)uVar89 & 1);
                  auVar129._0_4_ = (uint)bVar109 * auVar123._0_4_ | (uint)!bVar109 * auVar120._0_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar129._4_4_ = (uint)bVar109 * auVar123._4_4_ | (uint)!bVar109 * auVar120._4_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar129._8_4_ = (uint)bVar109 * auVar123._8_4_ | (uint)!bVar109 * auVar120._8_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar109 * auVar123._12_4_ | (uint)!bVar109 * auVar120._12_4_;
                  auVar120 = vfmadd231ps_avx512vl(auVar122,auVar129,auVar291);
                  auVar120 = vfmsub231ps_avx512vl(auVar120,auVar193,auVar121);
                  auVar120 = vsubps_avx512vl(auVar120,auVar128);
                  auVar120 = vfnmadd231ps_fma(auVar120,auVar138,auVar129);
                  auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar130._0_4_ =
                       (uint)bVar109 * auVar121._0_4_ |
                       (uint)!bVar109 * (int)(auVar120._0_4_ + auVar120._0_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar109 * auVar121._4_4_ |
                       (uint)!bVar109 * (int)(auVar120._4_4_ + auVar120._4_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar109 * auVar121._8_4_ |
                       (uint)!bVar109 * (int)(auVar120._8_4_ + auVar120._8_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar109 * auVar121._12_4_ |
                       (uint)!bVar109 * (int)(auVar120._12_4_ + auVar120._12_4_);
                  auVar120 = vminps_avx(auVar130,auVar134);
                  auVar120 = vmaxps_avx(auVar120,auVar135);
                  auVar121 = vfmadd213ps_fma(auVar136,auVar120,auVar193);
                  auVar122 = vcvttps2dq_avx512vl(auVar121);
                  auVar122 = vcvtdq2ps_avx512vl(auVar122);
                  uVar97 = vcmpps_avx512vl(auVar121,auVar122,1);
                  auVar121 = vsubps_avx512vl(auVar122,auVar145);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar131._0_4_ = (uint)bVar109 * auVar121._0_4_ | (uint)!bVar109 * auVar122._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar131._4_4_ = (uint)bVar109 * auVar121._4_4_ | (uint)!bVar109 * auVar122._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar131._8_4_ = (uint)bVar109 * auVar121._8_4_ | (uint)!bVar109 * auVar122._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar109 * auVar121._12_4_ | (uint)!bVar109 * auVar122._12_4_;
                  auVar120 = vfmsub231ps_avx512vl(auVar120,auVar131,auVar138);
                  auVar120 = vfnmsub231ps_avx512vl(auVar120,auVar131,auVar291);
                  auVar250._0_4_ = auVar120._0_4_ * auVar120._0_4_;
                  auVar250._4_4_ = auVar120._4_4_ * auVar120._4_4_;
                  auVar250._8_4_ = auVar120._8_4_ * auVar120._8_4_;
                  auVar250._12_4_ = auVar120._12_4_ * auVar120._12_4_;
                  auVar121 = vfmadd213ps_avx512vl(auVar110,auVar120,auVar137);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar252);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar273);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar279);
                  auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar193);
                  auVar120 = vfmadd213ps_avx512vl(auVar121,auVar250,auVar120);
                  auVar121 = vaddps_avx512vl(auVar120,auVar145);
                  auVar120 = vcvttps2dq_avx512vl(auVar131);
                  auVar120 = vpslld_avx(auVar120,0x17);
                  auVar120 = vpaddd_avx(auVar120,auVar285);
                  auVar121 = vfmadd213ps_fma(auVar120,auVar121,auVar145);
                  auVar120 = vrcpps_avx(auVar121);
                  auVar122 = vaddps_avx512vl(auVar120,auVar120);
                  auVar121 = vfmsub213ps_avx512vl(auVar121,auVar122,auVar119);
                  auVar120 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar122);
                  auVar126 = vfmsub231ps_fma(auVar126,auVar126,auVar120);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar122._4_4_ = uVar1;
                  auVar122._0_4_ = uVar1;
                  auVar122._8_4_ = uVar1;
                  auVar122._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar120._4_4_ = uVar1;
                  auVar120._0_4_ = uVar1;
                  auVar120._8_4_ = uVar1;
                  auVar120._12_4_ = uVar1;
                  auVar120 = vfmadd213ps_avx512vl(auVar122,auVar126,auVar120);
                  auVar120 = vmaxps_avx(auVar120,auVar133);
                  auVar120 = vminps_avx(auVar120,auVar145);
                  auVar121._0_4_ = auVar120._0_4_ * auVar126._0_4_;
                  auVar121._4_4_ = auVar120._4_4_ * auVar126._4_4_;
                  auVar121._8_4_ = auVar120._8_4_ * auVar126._8_4_;
                  auVar121._12_4_ = auVar120._12_4_ * auVar126._12_4_;
                  auVar126 = auVar121;
                }
                *pauVar90 = auVar126;
                pauVar90 = pauVar90 + 1;
                iVar98 = iVar98 + 8;
                bVar109 = iVar104 != iVar5;
                iVar104 = iVar104 + 1;
              } while (bVar109);
            }
            local_158 = local_158 + 1;
          } while (local_158 != (uVar11 & 0xffffffff));
        }
        if ((uVar4 == 4 && uVar82 == 0) && 0 < iVar79) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          auVar193 = ZEXT816(0) << 0x40;
          auVar203._8_4_ = 0x42b0c0a5;
          auVar203._0_8_ = 0x42b0c0a542b0c0a5;
          auVar203._12_4_ = 0x42b0c0a5;
          auVar208._8_4_ = 0xc2b0c0a5;
          auVar208._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar208._12_4_ = 0xc2b0c0a5;
          auVar212._8_4_ = 0x3f000000;
          auVar212._0_8_ = 0x3f0000003f000000;
          auVar212._12_4_ = 0x3f000000;
          auVar216._8_4_ = 0x3fb8aa3b;
          auVar216._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar216._12_4_ = 0x3fb8aa3b;
          auVar220._8_4_ = 0x3f800000;
          auVar220._0_8_ = 0x3f8000003f800000;
          auVar220._12_4_ = 0x3f800000;
          auVar224._8_4_ = 0x3f318000;
          auVar224._0_8_ = 0x3f3180003f318000;
          auVar224._12_4_ = 0x3f318000;
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar263._8_4_ = 0x3ab743ce;
          auVar263._0_8_ = 0x3ab743ce3ab743ce;
          auVar263._12_4_ = 0x3ab743ce;
          auVar268._8_4_ = 0x3c088908;
          auVar268._0_8_ = 0x3c0889083c088908;
          auVar268._12_4_ = 0x3c088908;
          auVar274._8_4_ = 0x3d2aa9c1;
          auVar274._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar274._12_4_ = 0x3d2aa9c1;
          auVar280._8_4_ = 0x3e2aaaaa;
          auVar280._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar280._12_4_ = 0x3e2aaaaa;
          auVar286._8_4_ = 0x3f800000;
          auVar286._0_8_ = 0x3f8000003f800000;
          auVar286._12_4_ = 0x3f800000;
          auVar292._8_4_ = 0xb95e8083;
          auVar292._0_8_ = 0xb95e8083b95e8083;
          auVar292._12_4_ = 0xb95e8083;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar133 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar135 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < iVar5) {
              pauVar90 = (undefined1 (*) [16])
                         ((long)top_blob->w * local_158 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar98 = 0;
              iVar104 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar136 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar136 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x190 + (long)p_Var6) + local_158 * 0x10);
                }
                auVar196 = ZEXT1664(auVar136);
                if (0 < iVar78) {
                  pauVar107 = (undefined1 (*) [16])
                              ((this->weight_data_packed).cstep * local_158 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var6 = pp_Var8[-3];
                  iVar87 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  puVar86 = (undefined4 *)
                            ((long)local_f8.data +
                            (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar98) * 4 + 0xc);
                  uVar97 = 0;
                  do {
                    if (0 < iVar87) {
                      puVar84 = puVar86;
                      pauVar101 = pauVar107;
                      iVar81 = iVar87;
                      do {
                        uVar1 = puVar84[-3];
                        auVar13._4_4_ = uVar1;
                        auVar13._0_4_ = uVar1;
                        auVar13._8_4_ = uVar1;
                        auVar13._12_4_ = uVar1;
                        auVar136 = vfmadd132ps_avx512vl(*pauVar101,auVar196._0_16_,auVar13);
                        uVar1 = puVar84[-2];
                        auVar14._4_4_ = uVar1;
                        auVar14._0_4_ = uVar1;
                        auVar14._8_4_ = uVar1;
                        auVar14._12_4_ = uVar1;
                        auVar136 = vfmadd231ps_avx512vl(auVar136,pauVar101[1],auVar14);
                        uVar1 = puVar84[-1];
                        auVar15._4_4_ = uVar1;
                        auVar15._0_4_ = uVar1;
                        auVar15._8_4_ = uVar1;
                        auVar15._12_4_ = uVar1;
                        auVar136 = vfmadd231ps_avx512vl(auVar136,pauVar101[2],auVar15);
                        uVar1 = *puVar84;
                        auVar16._4_4_ = uVar1;
                        auVar16._0_4_ = uVar1;
                        auVar16._8_4_ = uVar1;
                        auVar16._12_4_ = uVar1;
                        auVar136 = vfmadd231ps_avx512vl(auVar136,pauVar101[3],auVar16);
                        auVar196 = ZEXT1664(auVar136);
                        pauVar101 = pauVar101 + 4;
                        puVar84 = puVar84 + (*(int *)(&this->field_0xd8 + (long)p_Var6) << 2);
                        iVar81 = iVar81 + -1;
                      } while (iVar81 != 0);
                      pauVar107 = pauVar107 + (ulong)(iVar87 - 1) * 4 + 4;
                    }
                    auVar136 = auVar196._0_16_;
                    uVar97 = uVar97 + 1;
                    puVar86 = (undefined4 *)
                              ((long)puVar86 +
                              (long)local_f8.w *
                              CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize));
                  } while (uVar97 != uVar103);
                }
                p_Var6 = pp_Var7[-3];
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar136 = vmaxps_avx(auVar136,auVar193);
                  break;
                case 2:
                  auVar145 = vmaxps_avx(auVar136,auVar193);
                  auVar136 = vminps_avx(auVar136,auVar193);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar136 = vfmadd132ps_avx512vl(auVar136,auVar145,auVar33);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar136 = vmaxps_avx512vl(auVar136,auVar31);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar136 = vminps_avx512vl(auVar136,auVar32);
                  break;
                case 4:
                  auVar29._8_4_ = 0x80000000;
                  auVar29._0_8_ = 0x8000000080000000;
                  auVar29._12_4_ = 0x80000000;
                  auVar136 = vxorps_avx512vl(auVar136,auVar29);
                  auVar136 = vminps_avx(auVar136,auVar203);
                  auVar136 = vmaxps_avx(auVar136,auVar208);
                  auVar145 = vfmadd231ps_fma(auVar212,auVar136,auVar216);
                  auVar138 = vcvttps2dq_avx512vl(auVar145);
                  auVar138 = vcvtdq2ps_avx512vl(auVar138);
                  uVar97 = vcmpps_avx512vl(auVar145,auVar138,1);
                  auVar145 = vsubps_avx512vl(auVar138,auVar220);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar144._0_4_ = (uint)bVar109 * auVar145._0_4_ | (uint)!bVar109 * auVar138._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar144._4_4_ = (uint)bVar109 * auVar145._4_4_ | (uint)!bVar109 * auVar138._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar144._8_4_ = (uint)bVar109 * auVar145._8_4_ | (uint)!bVar109 * auVar138._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar144._12_4_ =
                       (uint)bVar109 * auVar145._12_4_ | (uint)!bVar109 * auVar138._12_4_;
                  auVar136 = vfmsub231ps_avx512vl(auVar136,auVar144,auVar224);
                  auVar30._8_4_ = 0x395e8083;
                  auVar30._0_8_ = 0x395e8083395e8083;
                  auVar30._12_4_ = 0x395e8083;
                  auVar145 = vfmsub231ps_avx512vl(auVar136,auVar144,auVar30);
                  auVar230._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar230._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar230._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar230._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar136 = vfmadd213ps_fma(auVar110,auVar145,auVar263);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar268);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar274);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar280);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar212);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar230,auVar145);
                  auVar231._0_4_ = auVar136._0_4_ + 1.0;
                  auVar231._4_4_ = auVar136._4_4_ + 1.0;
                  auVar231._8_4_ = auVar136._8_4_ + 1.0;
                  auVar231._12_4_ = auVar136._12_4_ + 1.0;
                  auVar136 = vcvttps2dq_avx512vl(auVar144);
                  auVar136 = vpslld_avx(auVar136,0x17);
                  auVar136 = vpaddd_avx(auVar286,auVar136);
                  auVar145 = vfmadd213ps_fma(auVar136,auVar231,auVar220);
                  auVar136 = vrcpps_avx(auVar145);
                  auVar145 = vfmsub213ps_fma(auVar145,auVar136,auVar220);
                  auVar136 = vfnmadd132ps_fma(auVar145,auVar136,auVar136);
                  break;
                case 5:
                  auVar145 = vminps_avx(auVar136,auVar203);
                  auVar145 = vmaxps_avx(auVar145,auVar208);
                  auVar138 = vfmadd213ps_fma(auVar216,auVar145,auVar212);
                  auVar137 = vcvttps2dq_avx512vl(auVar138);
                  auVar137 = vcvtdq2ps_avx512vl(auVar137);
                  uVar97 = vcmpps_avx512vl(auVar138,auVar137,1);
                  auVar138 = vsubps_avx512vl(auVar137,auVar220);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar139._0_4_ = (uint)bVar109 * auVar138._0_4_ | (uint)!bVar109 * auVar137._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar139._4_4_ = (uint)bVar109 * auVar138._4_4_ | (uint)!bVar109 * auVar137._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar139._8_4_ = (uint)bVar109 * auVar138._8_4_ | (uint)!bVar109 * auVar137._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar139._12_4_ =
                       (uint)bVar109 * auVar138._12_4_ | (uint)!bVar109 * auVar137._12_4_;
                  auVar145 = vfmsub231ps_avx512vl(auVar145,auVar139,auVar224);
                  auVar145 = vfnmsub231ps_avx512vl(auVar145,auVar139,auVar292);
                  auVar251._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar251._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar251._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar251._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar138 = vfmadd213ps_avx512vl(auVar110,auVar145,auVar263);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar268);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar274);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar280);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar212);
                  auVar145 = vfmadd213ps_avx512vl(auVar138,auVar251,auVar145);
                  auVar138 = vaddps_avx512vl(auVar145,auVar220);
                  auVar145 = vcvttps2dq_avx512vl(auVar139);
                  auVar145 = vpslld_avx(auVar145,0x17);
                  auVar145 = vpaddd_avx(auVar145,auVar286);
                  auVar145 = vfmadd213ps_fma(auVar145,auVar138,auVar220);
                  uVar97 = vcmpps_avx512vl(auVar145,auVar193,2);
                  auVar26._8_4_ = 0x800000;
                  auVar26._0_8_ = 0x80000000800000;
                  auVar26._12_4_ = 0x800000;
                  auVar145 = vmaxps_avx512vl(auVar145,auVar26);
                  auVar252 = vpsrld_avx(auVar145,0x17);
                  auVar138 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar27._8_4_ = 0x3f000000;
                  auVar27._0_8_ = 0x3f0000003f000000;
                  auVar27._12_4_ = 0x3f000000;
                  auVar145 = vpternlogd_avx512vl(auVar145,auVar138,auVar27,0xea);
                  uVar89 = vcmpps_avx512vl(auVar145,auVar111,1);
                  auVar138 = vaddps_avx512vl(auVar145,auVar112);
                  auVar145 = vaddps_avx512vl(auVar138,auVar145);
                  bVar109 = (bool)((byte)uVar89 & 1);
                  auVar140._0_4_ = (uint)bVar109 * auVar145._0_4_ | (uint)!bVar109 * auVar138._0_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar140._4_4_ = (uint)bVar109 * auVar145._4_4_ | (uint)!bVar109 * auVar138._4_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar140._8_4_ = (uint)bVar109 * auVar145._8_4_ | (uint)!bVar109 * auVar138._8_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar140._12_4_ =
                       (uint)bVar109 * auVar145._12_4_ | (uint)!bVar109 * auVar138._12_4_;
                  auVar138 = vmulps_avx512vl(auVar140,auVar140);
                  auVar145 = vfmadd213ps_avx512vl(auVar113,auVar140,auVar114);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar115);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar116);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar117);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar118);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar119);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar133);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar140,auVar134);
                  auVar137 = vmulps_avx512vl(auVar138,auVar140);
                  auVar137 = vmulps_avx512vl(auVar137,auVar145);
                  auVar28._8_4_ = 0xffffff82;
                  auVar28._0_8_ = 0xffffff82ffffff82;
                  auVar28._12_4_ = 0xffffff82;
                  auVar145 = vpaddd_avx512vl(auVar252,auVar28);
                  auVar145 = vcvtdq2ps_avx(auVar145);
                  auVar252 = vsubps_avx512vl(auVar145,auVar220);
                  bVar109 = (bool)((byte)uVar89 & 1);
                  auVar141._0_4_ = (uint)bVar109 * auVar252._0_4_ | (uint)!bVar109 * auVar145._0_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar141._4_4_ = (uint)bVar109 * auVar252._4_4_ | (uint)!bVar109 * auVar145._4_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar141._8_4_ = (uint)bVar109 * auVar252._8_4_ | (uint)!bVar109 * auVar145._8_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar141._12_4_ =
                       (uint)bVar109 * auVar252._12_4_ | (uint)!bVar109 * auVar145._12_4_;
                  auVar145 = vfmadd231ps_avx512vl(auVar137,auVar141,auVar292);
                  auVar145 = vfmsub231ps_avx512vl(auVar145,auVar212,auVar138);
                  auVar145 = vsubps_avx512vl(auVar145,auVar140);
                  auVar145 = vfnmadd231ps_fma(auVar145,auVar224,auVar141);
                  auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar142._0_4_ =
                       (uint)bVar109 * auVar138._0_4_ |
                       (uint)!bVar109 * (int)(auVar145._0_4_ + auVar145._0_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar142._4_4_ =
                       (uint)bVar109 * auVar138._4_4_ |
                       (uint)!bVar109 * (int)(auVar145._4_4_ + auVar145._4_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar142._8_4_ =
                       (uint)bVar109 * auVar138._8_4_ |
                       (uint)!bVar109 * (int)(auVar145._8_4_ + auVar145._8_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar142._12_4_ =
                       (uint)bVar109 * auVar138._12_4_ |
                       (uint)!bVar109 * (int)(auVar145._12_4_ + auVar145._12_4_);
                  auVar145 = vminps_avx(auVar142,auVar203);
                  auVar145 = vmaxps_avx(auVar145,auVar208);
                  auVar138 = vfmadd213ps_fma(auVar216,auVar145,auVar212);
                  auVar137 = vcvttps2dq_avx512vl(auVar138);
                  auVar137 = vcvtdq2ps_avx512vl(auVar137);
                  uVar97 = vcmpps_avx512vl(auVar138,auVar137,1);
                  auVar138 = vsubps_avx512vl(auVar137,auVar220);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar143._0_4_ = (uint)bVar109 * auVar138._0_4_ | (uint)!bVar109 * auVar137._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar143._4_4_ = (uint)bVar109 * auVar138._4_4_ | (uint)!bVar109 * auVar137._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar143._8_4_ = (uint)bVar109 * auVar138._8_4_ | (uint)!bVar109 * auVar137._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar143._12_4_ =
                       (uint)bVar109 * auVar138._12_4_ | (uint)!bVar109 * auVar137._12_4_;
                  auVar145 = vfmsub231ps_avx512vl(auVar145,auVar143,auVar224);
                  auVar145 = vfnmsub231ps_avx512vl(auVar145,auVar143,auVar292);
                  auVar253._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar253._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar253._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar253._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar138 = vfmadd213ps_avx512vl(auVar110,auVar145,auVar263);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar268);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar274);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar280);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar212);
                  auVar145 = vfmadd213ps_avx512vl(auVar138,auVar253,auVar145);
                  auVar138 = vaddps_avx512vl(auVar145,auVar220);
                  auVar145 = vcvttps2dq_avx512vl(auVar143);
                  auVar145 = vpslld_avx(auVar145,0x17);
                  auVar145 = vpaddd_avx(auVar145,auVar286);
                  auVar138 = vfmadd213ps_fma(auVar145,auVar138,auVar220);
                  auVar145 = vrcpps_avx(auVar138);
                  auVar137 = vaddps_avx512vl(auVar145,auVar145);
                  auVar138 = vfmsub213ps_avx512vl(auVar138,auVar137,auVar135);
                  auVar145 = vfnmadd213ps_avx512vl(auVar138,auVar145,auVar137);
                  auVar136 = vfmsub231ps_fma(auVar136,auVar136,auVar145);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar232._4_4_ = uVar1;
                  auVar232._0_4_ = uVar1;
                  auVar232._8_4_ = uVar1;
                  auVar232._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar145 = vfmadd213ps_avx512vl(auVar232,auVar136,auVar25);
                  auVar145 = vmaxps_avx(auVar145,auVar193);
                  auVar145 = vminps_avx(auVar145,auVar220);
                  auVar194._0_4_ = auVar145._0_4_ * auVar136._0_4_;
                  auVar194._4_4_ = auVar145._4_4_ * auVar136._4_4_;
                  auVar194._8_4_ = auVar145._8_4_ * auVar136._8_4_;
                  auVar194._12_4_ = auVar145._12_4_ * auVar136._12_4_;
                  auVar136 = auVar194;
                }
                *pauVar90 = auVar136;
                pauVar90 = pauVar90 + 1;
                iVar98 = iVar98 + 4;
                bVar109 = iVar104 != iVar5;
                iVar104 = iVar104 + 1;
              } while (bVar109);
            }
            local_158 = local_158 + 1;
          } while (local_158 != (uVar11 & 0xffffffff));
        }
        if ((uVar82 == 0 && uVar4 == 1) && 0 < iVar79) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_150 = 0;
          auVar193 = ZEXT816(0) << 0x40;
          auVar204._8_4_ = 0x42b0c0a5;
          auVar204._0_8_ = 0x42b0c0a542b0c0a5;
          auVar204._12_4_ = 0x42b0c0a5;
          auVar209._8_4_ = 0xc2b0c0a5;
          auVar209._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar209._12_4_ = 0xc2b0c0a5;
          auVar213._8_4_ = 0x3f000000;
          auVar213._0_8_ = 0x3f0000003f000000;
          auVar213._12_4_ = 0x3f000000;
          auVar217._8_4_ = 0x3fb8aa3b;
          auVar217._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar217._12_4_ = 0x3fb8aa3b;
          auVar221._8_4_ = 0x3f800000;
          auVar221._0_8_ = 0x3f8000003f800000;
          auVar221._12_4_ = 0x3f800000;
          auVar225._8_4_ = 0x3f318000;
          auVar225._0_8_ = 0x3f3180003f318000;
          auVar225._12_4_ = 0x3f318000;
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar264._8_4_ = 0x3ab743ce;
          auVar264._0_8_ = 0x3ab743ce3ab743ce;
          auVar264._12_4_ = 0x3ab743ce;
          auVar269._8_4_ = 0x3c088908;
          auVar269._0_8_ = 0x3c0889083c088908;
          auVar269._12_4_ = 0x3c088908;
          auVar275._8_4_ = 0x3d2aa9c1;
          auVar275._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar275._12_4_ = 0x3d2aa9c1;
          auVar281._8_4_ = 0x3e2aaaaa;
          auVar281._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar281._12_4_ = 0x3e2aaaaa;
          auVar287._8_4_ = 0x3f800000;
          auVar287._0_8_ = 0x3f8000003f800000;
          auVar287._12_4_ = 0x3f800000;
          auVar293._8_4_ = 0xb95e8083;
          auVar293._0_8_ = 0xb95e8083b95e8083;
          auVar293._12_4_ = 0xb95e8083;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar133 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar135 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < iVar5) {
              pauVar90 = (undefined1 (*) [16])
                         ((long)top_blob->w * local_150 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar104 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar136 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar136 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x190 + (long)p_Var6) + local_150 * 0x10);
                }
                auVar196 = ZEXT1664(auVar136);
                if (0 < iVar78) {
                  pauVar107 = (undefined1 (*) [16])
                              ((this->weight_data_packed).cstep * local_150 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var6 = pp_Var8[-3];
                  iVar98 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  puVar86 = (undefined4 *)
                            ((long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar104) * 4 +
                            (long)local_f8.data);
                  uVar97 = 0;
                  do {
                    if (0 < iVar98) {
                      puVar84 = puVar86;
                      pauVar101 = pauVar107;
                      iVar87 = iVar98;
                      do {
                        uVar1 = *puVar84;
                        auVar233._4_4_ = uVar1;
                        auVar233._0_4_ = uVar1;
                        auVar233._8_4_ = uVar1;
                        auVar233._12_4_ = uVar1;
                        auVar136 = vfmadd231ps_fma(auVar196._0_16_,auVar233,*pauVar101);
                        auVar196 = ZEXT1664(auVar136);
                        pauVar101 = pauVar101 + 1;
                        puVar84 = puVar84 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                        iVar87 = iVar87 + -1;
                      } while (iVar87 != 0);
                      pauVar107 = pauVar107 + (ulong)(iVar98 - 1) + 1;
                    }
                    auVar136 = auVar196._0_16_;
                    uVar97 = uVar97 + 1;
                    puVar86 = (undefined4 *)
                              ((long)puVar86 +
                              (long)local_f8.w *
                              CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize));
                  } while (uVar97 != uVar103);
                }
                p_Var6 = pp_Var7[-3];
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar136 = vmaxps_avx(auVar136,auVar193);
                  break;
                case 2:
                  auVar145 = vmaxps_avx(auVar136,auVar193);
                  auVar136 = vminps_avx(auVar136,auVar193);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar136 = vfmadd132ps_avx512vl(auVar136,auVar145,auVar42);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar136 = vmaxps_avx512vl(auVar136,auVar40);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar136 = vminps_avx512vl(auVar136,auVar41);
                  break;
                case 4:
                  auVar38._8_4_ = 0x80000000;
                  auVar38._0_8_ = 0x8000000080000000;
                  auVar38._12_4_ = 0x80000000;
                  auVar136 = vxorps_avx512vl(auVar136,auVar38);
                  auVar136 = vminps_avx(auVar136,auVar204);
                  auVar136 = vmaxps_avx(auVar136,auVar209);
                  auVar145 = vfmadd231ps_fma(auVar213,auVar136,auVar217);
                  auVar138 = vcvttps2dq_avx512vl(auVar145);
                  auVar138 = vcvtdq2ps_avx512vl(auVar138);
                  uVar97 = vcmpps_avx512vl(auVar145,auVar138,1);
                  auVar145 = vsubps_avx512vl(auVar138,auVar221);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar151._0_4_ = (uint)bVar109 * auVar145._0_4_ | (uint)!bVar109 * auVar138._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar151._4_4_ = (uint)bVar109 * auVar145._4_4_ | (uint)!bVar109 * auVar138._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar151._8_4_ = (uint)bVar109 * auVar145._8_4_ | (uint)!bVar109 * auVar138._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar151._12_4_ =
                       (uint)bVar109 * auVar145._12_4_ | (uint)!bVar109 * auVar138._12_4_;
                  auVar136 = vfmsub231ps_avx512vl(auVar136,auVar151,auVar225);
                  auVar39._8_4_ = 0x395e8083;
                  auVar39._0_8_ = 0x395e8083395e8083;
                  auVar39._12_4_ = 0x395e8083;
                  auVar145 = vfmsub231ps_avx512vl(auVar136,auVar151,auVar39);
                  auVar234._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar234._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar234._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar234._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar136 = vfmadd213ps_fma(auVar110,auVar145,auVar264);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar269);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar275);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar281);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar145,auVar213);
                  auVar136 = vfmadd213ps_fma(auVar136,auVar234,auVar145);
                  auVar235._0_4_ = auVar136._0_4_ + 1.0;
                  auVar235._4_4_ = auVar136._4_4_ + 1.0;
                  auVar235._8_4_ = auVar136._8_4_ + 1.0;
                  auVar235._12_4_ = auVar136._12_4_ + 1.0;
                  auVar136 = vcvttps2dq_avx512vl(auVar151);
                  auVar136 = vpslld_avx(auVar136,0x17);
                  auVar136 = vpaddd_avx(auVar287,auVar136);
                  auVar145 = vfmadd213ps_fma(auVar136,auVar235,auVar221);
                  auVar136 = vrcpps_avx(auVar145);
                  auVar145 = vfmsub213ps_fma(auVar145,auVar136,auVar221);
                  auVar136 = vfnmadd132ps_fma(auVar145,auVar136,auVar136);
                  break;
                case 5:
                  auVar145 = vminps_avx(auVar136,auVar204);
                  auVar145 = vmaxps_avx(auVar145,auVar209);
                  auVar138 = vfmadd213ps_fma(auVar217,auVar145,auVar213);
                  auVar137 = vcvttps2dq_avx512vl(auVar138);
                  auVar137 = vcvtdq2ps_avx512vl(auVar137);
                  uVar97 = vcmpps_avx512vl(auVar138,auVar137,1);
                  auVar138 = vsubps_avx512vl(auVar137,auVar221);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar146._0_4_ = (uint)bVar109 * auVar138._0_4_ | (uint)!bVar109 * auVar137._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar146._4_4_ = (uint)bVar109 * auVar138._4_4_ | (uint)!bVar109 * auVar137._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar146._8_4_ = (uint)bVar109 * auVar138._8_4_ | (uint)!bVar109 * auVar137._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar146._12_4_ =
                       (uint)bVar109 * auVar138._12_4_ | (uint)!bVar109 * auVar137._12_4_;
                  auVar145 = vfmsub231ps_avx512vl(auVar145,auVar146,auVar225);
                  auVar145 = vfnmsub231ps_avx512vl(auVar145,auVar146,auVar293);
                  auVar254._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar254._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar254._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar254._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar138 = vfmadd213ps_avx512vl(auVar110,auVar145,auVar264);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar269);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar275);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar281);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar213);
                  auVar145 = vfmadd213ps_avx512vl(auVar138,auVar254,auVar145);
                  auVar138 = vaddps_avx512vl(auVar145,auVar221);
                  auVar145 = vcvttps2dq_avx512vl(auVar146);
                  auVar145 = vpslld_avx(auVar145,0x17);
                  auVar145 = vpaddd_avx(auVar145,auVar287);
                  auVar145 = vfmadd213ps_fma(auVar145,auVar138,auVar221);
                  uVar97 = vcmpps_avx512vl(auVar145,auVar193,2);
                  auVar35._8_4_ = 0x800000;
                  auVar35._0_8_ = 0x80000000800000;
                  auVar35._12_4_ = 0x800000;
                  auVar145 = vmaxps_avx512vl(auVar145,auVar35);
                  auVar252 = vpsrld_avx(auVar145,0x17);
                  auVar138 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar36._8_4_ = 0x3f000000;
                  auVar36._0_8_ = 0x3f0000003f000000;
                  auVar36._12_4_ = 0x3f000000;
                  auVar145 = vpternlogd_avx512vl(auVar145,auVar138,auVar36,0xea);
                  uVar89 = vcmpps_avx512vl(auVar145,auVar111,1);
                  auVar138 = vaddps_avx512vl(auVar145,auVar112);
                  auVar145 = vaddps_avx512vl(auVar138,auVar145);
                  bVar109 = (bool)((byte)uVar89 & 1);
                  auVar147._0_4_ = (uint)bVar109 * auVar145._0_4_ | (uint)!bVar109 * auVar138._0_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar147._4_4_ = (uint)bVar109 * auVar145._4_4_ | (uint)!bVar109 * auVar138._4_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar147._8_4_ = (uint)bVar109 * auVar145._8_4_ | (uint)!bVar109 * auVar138._8_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar147._12_4_ =
                       (uint)bVar109 * auVar145._12_4_ | (uint)!bVar109 * auVar138._12_4_;
                  auVar138 = vmulps_avx512vl(auVar147,auVar147);
                  auVar145 = vfmadd213ps_avx512vl(auVar113,auVar147,auVar114);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar115);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar116);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar117);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar118);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar119);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar133);
                  auVar145 = vfmadd213ps_avx512vl(auVar145,auVar147,auVar134);
                  auVar137 = vmulps_avx512vl(auVar138,auVar147);
                  auVar137 = vmulps_avx512vl(auVar137,auVar145);
                  auVar37._8_4_ = 0xffffff82;
                  auVar37._0_8_ = 0xffffff82ffffff82;
                  auVar37._12_4_ = 0xffffff82;
                  auVar145 = vpaddd_avx512vl(auVar252,auVar37);
                  auVar145 = vcvtdq2ps_avx(auVar145);
                  auVar252 = vsubps_avx512vl(auVar145,auVar221);
                  bVar109 = (bool)((byte)uVar89 & 1);
                  auVar148._0_4_ = (uint)bVar109 * auVar252._0_4_ | (uint)!bVar109 * auVar145._0_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar148._4_4_ = (uint)bVar109 * auVar252._4_4_ | (uint)!bVar109 * auVar145._4_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar148._8_4_ = (uint)bVar109 * auVar252._8_4_ | (uint)!bVar109 * auVar145._8_4_;
                  bVar109 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar148._12_4_ =
                       (uint)bVar109 * auVar252._12_4_ | (uint)!bVar109 * auVar145._12_4_;
                  auVar145 = vfmadd231ps_avx512vl(auVar137,auVar148,auVar293);
                  auVar145 = vfmsub231ps_avx512vl(auVar145,auVar213,auVar138);
                  auVar145 = vsubps_avx512vl(auVar145,auVar147);
                  auVar145 = vfnmadd231ps_fma(auVar145,auVar225,auVar148);
                  auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar149._0_4_ =
                       (uint)bVar109 * auVar138._0_4_ |
                       (uint)!bVar109 * (int)(auVar145._0_4_ + auVar145._0_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar149._4_4_ =
                       (uint)bVar109 * auVar138._4_4_ |
                       (uint)!bVar109 * (int)(auVar145._4_4_ + auVar145._4_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar149._8_4_ =
                       (uint)bVar109 * auVar138._8_4_ |
                       (uint)!bVar109 * (int)(auVar145._8_4_ + auVar145._8_4_);
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar149._12_4_ =
                       (uint)bVar109 * auVar138._12_4_ |
                       (uint)!bVar109 * (int)(auVar145._12_4_ + auVar145._12_4_);
                  auVar145 = vminps_avx(auVar149,auVar204);
                  auVar145 = vmaxps_avx(auVar145,auVar209);
                  auVar138 = vfmadd213ps_fma(auVar217,auVar145,auVar213);
                  auVar137 = vcvttps2dq_avx512vl(auVar138);
                  auVar137 = vcvtdq2ps_avx512vl(auVar137);
                  uVar97 = vcmpps_avx512vl(auVar138,auVar137,1);
                  auVar138 = vsubps_avx512vl(auVar137,auVar221);
                  bVar109 = (bool)((byte)uVar97 & 1);
                  auVar150._0_4_ = (uint)bVar109 * auVar138._0_4_ | (uint)!bVar109 * auVar137._0_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar150._4_4_ = (uint)bVar109 * auVar138._4_4_ | (uint)!bVar109 * auVar137._4_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar150._8_4_ = (uint)bVar109 * auVar138._8_4_ | (uint)!bVar109 * auVar137._8_4_;
                  bVar109 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar150._12_4_ =
                       (uint)bVar109 * auVar138._12_4_ | (uint)!bVar109 * auVar137._12_4_;
                  auVar145 = vfmsub231ps_avx512vl(auVar145,auVar150,auVar225);
                  auVar145 = vfnmsub231ps_avx512vl(auVar145,auVar150,auVar293);
                  auVar255._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar255._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar255._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar255._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar138 = vfmadd213ps_avx512vl(auVar110,auVar145,auVar264);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar269);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar275);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar281);
                  auVar138 = vfmadd213ps_avx512vl(auVar138,auVar145,auVar213);
                  auVar145 = vfmadd213ps_avx512vl(auVar138,auVar255,auVar145);
                  auVar138 = vaddps_avx512vl(auVar145,auVar221);
                  auVar145 = vcvttps2dq_avx512vl(auVar150);
                  auVar145 = vpslld_avx(auVar145,0x17);
                  auVar145 = vpaddd_avx(auVar145,auVar287);
                  auVar138 = vfmadd213ps_fma(auVar145,auVar138,auVar221);
                  auVar145 = vrcpps_avx(auVar138);
                  auVar137 = vaddps_avx512vl(auVar145,auVar145);
                  auVar138 = vfmsub213ps_avx512vl(auVar138,auVar137,auVar135);
                  auVar145 = vfnmadd213ps_avx512vl(auVar138,auVar145,auVar137);
                  auVar136 = vfmsub231ps_fma(auVar136,auVar136,auVar145);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar236._4_4_ = uVar1;
                  auVar236._0_4_ = uVar1;
                  auVar236._8_4_ = uVar1;
                  auVar236._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar145 = vfmadd213ps_avx512vl(auVar236,auVar136,auVar34);
                  auVar145 = vmaxps_avx(auVar145,auVar193);
                  auVar145 = vminps_avx(auVar145,auVar221);
                  auVar195._0_4_ = auVar145._0_4_ * auVar136._0_4_;
                  auVar195._4_4_ = auVar145._4_4_ * auVar136._4_4_;
                  auVar195._8_4_ = auVar145._8_4_ * auVar136._8_4_;
                  auVar195._12_4_ = auVar145._12_4_ * auVar136._12_4_;
                  auVar136 = auVar195;
                }
                *pauVar90 = auVar136;
                pauVar90 = pauVar90 + 1;
                bVar109 = iVar104 != iVar5;
                iVar104 = iVar104 + 1;
              } while (bVar109);
            }
            local_150 = local_150 + 1;
          } while (local_150 != (uVar11 & 0xffffffff));
        }
        if ((uVar4 == 4 && local_ac == 0) && 0 < iVar79) {
          local_90 = top_blob->data;
          local_98 = (long)top_blob->w * top_blob->elemsize;
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_a0 = (this->weight_data_packed).data;
          local_a8 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
          local_88 = uVar11 & 0xffffffff;
          local_158 = 0;
          do {
            pvVar77 = local_90;
            pvVar9 = local_f8.data;
            if (-1 < iVar5) {
              lVar83 = local_98 * local_158;
              pfVar85 = (float *)(local_a8 * local_158 + (long)local_a0);
              lVar108 = (long)local_f8.w;
              lVar91 = CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize);
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar104 = 0;
              uVar97 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar196 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar196 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                              local_158 * 4));
                }
                auVar110 = auVar196._0_16_;
                if (0 < iVar78) {
                  p_Var6 = pp_Var8[-3];
                  iVar98 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  pfVar88 = (float *)((long)pvVar9 +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar104) *
                                     4);
                  uVar89 = 0;
                  pfVar96 = pfVar85;
                  do {
                    if (0 < iVar98) {
                      pfVar95 = pfVar96;
                      pfVar102 = pfVar88;
                      iVar87 = iVar98;
                      do {
                        auVar114._0_4_ = *pfVar95 * *pfVar102;
                        auVar114._4_4_ = pfVar95[1] * pfVar102[1];
                        auVar114._8_4_ = pfVar95[2] * pfVar102[2];
                        auVar114._12_4_ = pfVar95[3] * pfVar102[3];
                        auVar110 = vshufpd_avx(auVar114,auVar114,1);
                        auVar115._0_4_ = auVar110._0_4_ + auVar114._0_4_;
                        auVar115._4_4_ = auVar110._4_4_ + auVar114._4_4_;
                        auVar115._8_4_ = auVar110._8_4_ + auVar114._8_4_;
                        auVar115._12_4_ = auVar110._12_4_ + auVar114._12_4_;
                        auVar110 = vmovshdup_avx(auVar115);
                        auVar196 = ZEXT464((uint)(auVar110._0_4_ + auVar196._0_4_ + auVar115._0_4_))
                        ;
                        pfVar95 = pfVar95 + 4;
                        pfVar102 = pfVar102 + (*(int *)(&this->field_0xd8 + (long)p_Var6) << 2);
                        iVar87 = iVar87 + -1;
                      } while (iVar87 != 0);
                      pfVar96 = pfVar96 + (ulong)(iVar98 - 1) * 4 + 4;
                    }
                    auVar110 = auVar196._0_16_;
                    uVar89 = uVar89 + 1;
                    pfVar88 = (float *)((long)pfVar88 + lVar108 * lVar91);
                  } while (uVar89 != uVar103);
                }
                p_Var6 = pp_Var7[-3];
                fVar191 = auVar110._0_4_;
                fVar192 = fVar191;
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar110 = vmaxss_avx(auVar110,ZEXT416(0));
                  fVar192 = auVar110._0_4_;
                  break;
                case 2:
                  uVar12 = vcmpss_avx512f(auVar110,ZEXT416(0),0xe);
                  bVar109 = (bool)((byte)uVar12 & 1);
                  fVar192 = (float)((uint)bVar109 * 0x3f800000 +
                                   (uint)!bVar109 * **(int **)(&this->field_0xf8 + (long)p_Var6)) *
                            fVar191;
                  break;
                case 3:
                  fVar191 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar110 = vmaxss_avx(auVar110,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var6)));
                  fVar192 = auVar110._0_4_;
                  if (fVar191 < auVar110._0_4_) {
                    fVar192 = fVar191;
                  }
                  break;
                case 4:
                  auVar110 = vminss_avx(auVar110,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar117._8_4_ = 0x80000000;
                  auVar117._0_8_ = 0x8000000080000000;
                  auVar117._12_4_ = 0x80000000;
                  auVar111 = vxorps_avx512vl(auVar110,auVar117);
                  uVar12 = vcmpss_avx512f(auVar110,ZEXT416(0xc2b0c0a5),1);
                  bVar109 = (bool)((byte)uVar12 & 1);
                  fVar192 = expf((float)((uint)bVar109 * 0x42b0c0a5 +
                                        (uint)!bVar109 * auVar111._0_4_));
                  fVar192 = 1.0 / (fVar192 + 1.0);
                  break;
                case 5:
                  fVar192 = expf(fVar191);
                  fVar192 = logf(fVar192 + 1.0);
                  fVar192 = tanhf(fVar192);
                  fVar192 = fVar192 * fVar191;
                  break;
                case 6:
                  fVar3 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                  auVar116._8_4_ = 0x80000000;
                  auVar116._0_8_ = 0x8000000080000000;
                  auVar116._12_4_ = 0x80000000;
                  auVar112 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var6))[1]);
                  auVar111 = vxorps_avx512vl(auVar112,auVar116);
                  fVar207 = auVar111._0_4_ / fVar3;
                  fVar192 = 0.0;
                  if ((fVar207 <= fVar191) && (fVar192 = fVar191, fVar191 <= fVar207 + 1.0 / fVar3))
                  {
                    auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar110,auVar112);
                    fVar192 = auVar110._0_4_ * fVar191;
                  }
                }
                *(float *)((long)pvVar77 + uVar97 * 4 + lVar83) = fVar192;
                uVar97 = uVar97 + 1;
                iVar104 = iVar104 + 4;
              } while (uVar97 != local_80);
            }
            local_158 = local_158 + 1;
          } while (local_158 != local_88);
        }
        local_ac = local_ac | uVar4 ^ 1;
        if (local_ac == 0 && 0 < iVar79) {
          pvVar9 = top_blob->data;
          iVar79 = top_blob->w;
          sVar10 = top_blob->elemsize;
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_148 = 0;
          do {
            pvVar77 = local_f8.data;
            if (-1 < iVar5) {
              lVar83 = (long)local_f8.w;
              lVar91 = CONCAT44(local_f8.elemsize._4_4_,(uint)local_f8.elemsize);
              uVar97 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar196 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar196 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                              local_148 * 4));
                }
                auVar110 = auVar196._0_16_;
                if (0 < iVar78) {
                  iVar104 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  lVar108 = (long)((int)local_148 * iVar78 * iVar104) * 4 +
                            *(long *)(&this->field_0x148 + (long)p_Var6);
                  puVar99 = (uint *)((long)pvVar77 +
                                    (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * (int)uVar97)
                                    * 4);
                  uVar89 = 0;
                  do {
                    if (0 < iVar104) {
                      lVar105 = 0;
                      puVar94 = puVar99;
                      do {
                        auVar110 = vfmadd231ss_fma(auVar196._0_16_,
                                                   ZEXT416(*(uint *)(lVar108 + lVar105 * 4)),
                                                   ZEXT416(*puVar94));
                        auVar196 = ZEXT1664(auVar110);
                        lVar105 = lVar105 + 1;
                        puVar94 = puVar94 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                      } while (iVar104 != (int)lVar105);
                      lVar108 = lVar108 + 4 + (ulong)(iVar104 - 1) * 4;
                    }
                    auVar110 = auVar196._0_16_;
                    uVar89 = uVar89 + 1;
                    puVar99 = (uint *)((long)puVar99 + lVar83 * lVar91);
                  } while (uVar89 != uVar103);
                }
                fVar191 = auVar110._0_4_;
                fVar192 = fVar191;
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar110 = vmaxss_avx(auVar110,ZEXT416(0));
                  fVar192 = auVar110._0_4_;
                  break;
                case 2:
                  uVar12 = vcmpss_avx512f(auVar110,ZEXT416(0),0xe);
                  bVar109 = (bool)((byte)uVar12 & 1);
                  fVar192 = (float)((uint)bVar109 * 0x3f800000 +
                                   (uint)!bVar109 * **(int **)(&this->field_0xf8 + (long)p_Var6)) *
                            fVar191;
                  break;
                case 3:
                  fVar191 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar110 = vmaxss_avx(auVar110,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var6)));
                  fVar192 = auVar110._0_4_;
                  if (fVar191 < auVar110._0_4_) {
                    fVar192 = fVar191;
                  }
                  break;
                case 4:
                  auVar110 = vminss_avx(auVar110,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar119._8_4_ = 0x80000000;
                  auVar119._0_8_ = 0x8000000080000000;
                  auVar119._12_4_ = 0x80000000;
                  auVar111 = vxorps_avx512vl(auVar110,auVar119);
                  uVar12 = vcmpss_avx512f(auVar110,ZEXT416(0xc2b0c0a5),1);
                  bVar109 = (bool)((byte)uVar12 & 1);
                  fVar192 = expf((float)((uint)bVar109 * 0x42b0c0a5 +
                                        (uint)!bVar109 * auVar111._0_4_));
                  fVar192 = 1.0 / (fVar192 + 1.0);
                  break;
                case 5:
                  fVar192 = expf(fVar191);
                  fVar192 = logf(fVar192 + 1.0);
                  fVar192 = tanhf(fVar192);
                  fVar192 = fVar192 * fVar191;
                  break;
                case 6:
                  fVar3 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                  auVar118._8_4_ = 0x80000000;
                  auVar118._0_8_ = 0x8000000080000000;
                  auVar118._12_4_ = 0x80000000;
                  auVar112 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var6))[1]);
                  auVar111 = vxorps_avx512vl(auVar112,auVar118);
                  fVar207 = auVar111._0_4_ / fVar3;
                  fVar192 = 0.0;
                  if ((fVar207 <= fVar191) && (fVar192 = fVar191, fVar191 <= fVar207 + 1.0 / fVar3))
                  {
                    auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar110,auVar112);
                    fVar192 = auVar110._0_4_ * fVar191;
                  }
                }
                *(float *)((long)pvVar9 + uVar97 * 4 + (long)iVar79 * sVar10 * local_148) = fVar192;
                uVar97 = uVar97 + 1;
              } while (uVar97 != local_80);
            }
            local_148 = local_148 + 1;
          } while (local_148 != (uVar11 & 0xffffffff));
        }
        iVar104 = 0;
      }
    }
    piVar76 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar76 != (int *)0x0) {
      LOCK();
      *piVar76 = *piVar76 + -1;
      UNLOCK();
      if (*piVar76 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar104;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}